

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

_Bool av1_rd_pick_partition
                (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
                int mi_row,int mi_col,BLOCK_SIZE bsize,RD_STATS *rd_cost,RD_STATS best_rdc,
                PC_TREE *pc_tree,SIMPLE_MOTION_DATA_TREE *sms_tree,int64_t *none_rd,
                SB_MULTI_PASS_MODE multi_pass_mode,RD_RECT_PART_WIN_INFO *rect_part_win_info)

{
  byte *pbVar1;
  uint8_t uVar2;
  char cVar3;
  PARTITION_SEARCH_TYPE PVar4;
  aom_cdf_prob aVar5;
  SequenceHeader *pSVar6;
  FRAME_CONTEXT *pFVar7;
  aom_internal_error_info *paVar8;
  long lVar9;
  YV12_BUFFER_CONFIG *pYVar10;
  code *pcVar11;
  TileDataEnc *tile_data_00;
  PARTITION_CONTEXT *pPVar12;
  MB_MODE_INFO *pMVar13;
  ThreadData_conflict *pTVar14;
  undefined8 *puVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  PICK_MODE_CONTEXT *pPVar19;
  PICK_MODE_CONTEXT *pPVar20;
  PICK_MODE_CONTEXT *pPVar21;
  int64_t iVar22;
  AV1_COMP *pAVar23;
  BLOCK_SIZE BVar24;
  _Bool _Var25;
  undefined1 extraout_AL;
  undefined1 uVar26;
  int iVar27;
  PICK_MODE_CONTEXT *pPVar28;
  PC_TREE *pPVar29;
  undefined4 extraout_var;
  PICK_MODE_CONTEXT **ppPVar30;
  uint8_t *puVar31;
  undefined7 uVar35;
  long *plVar32;
  char *pcVar33;
  void *pvVar34;
  char cVar36;
  short sVar37;
  uint uVar38;
  BLOCK_SIZE *pBVar39;
  uint *tp_00;
  ulong uVar40;
  int *inv_map;
  AV1_COMP *tile_data_01;
  BLOCK_SIZE (*paBVar41) [6];
  AV1_COMP *extraout_RDX;
  AV1_COMP *extraout_RDX_00;
  AV1_COMP *extraout_RDX_01;
  AV1_COMP *extraout_RDX_02;
  size_t __n;
  int i;
  long lVar42;
  BLOCK_SIZE *pBVar43;
  long *plVar44;
  BLOCK_SIZE (*pc_tree_00) [2] [2];
  long *plVar45;
  undefined8 *puVar46;
  BLOCK_SIZE BVar47;
  int iVar48;
  uint8_t *td_00;
  int iVar49;
  AV1_COMP *pAVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  int *piVar54;
  BLOCK_SIZE BVar55;
  int iVar56;
  ulong uVar57;
  ulong uVar58;
  RD_RECT_PART_WIN_INFO *rect_part_win_info_00;
  undefined1 uVar59;
  byte bVar60;
  uint *puVar61;
  byte bVar62;
  uint uVar63;
  undefined1 (*pauVar64) [16];
  AV1_COMP *pAVar65;
  uint *puVar66;
  bool bVar67;
  BLOCK_SIZE *part_none_rd;
  ulong uVar68;
  undefined2 in_FS;
  bool bVar69;
  double dVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined4 uVar76;
  undefined4 uVar77;
  int iVar78;
  BLOCK_SIZE local_5d8 [64];
  RUN_TYPE aRStackY_598 [8];
  BLOCK_SIZE local_590 [8];
  PARTITION_TYPE local_580 [16];
  ThreadData_conflict *local_570;
  AV1_COMP *local_568;
  ulong local_560 [2];
  BLOCK_SIZE local_550 [24];
  undefined1 auStack_538 [4];
  int local_534;
  BLOCK_SIZE local_530 [8];
  TileDataEnc *local_528;
  undefined4 local_51c;
  int part4_search_allowed [2];
  PartitionSearchState part_search_state;
  BLOCK_SIZE local_364 [8];
  BLOCK_SIZE local_35c [68];
  double var_max;
  undefined1 local_2f8 [96];
  SuperBlockEnc *local_298;
  PICK_MODE_CONTEXT **local_290;
  PICK_MODE_CONTEXT **local_288;
  undefined1 local_260 [8];
  double var_max_1;
  undefined1 *local_210;
  PICK_MODE_CONTEXT **local_208;
  PICK_MODE_CONTEXT **local_200;
  PICK_MODE_CONTEXT **local_1f8;
  PICK_MODE_CONTEXT **local_1f0;
  PICK_MODE_CONTEXT **local_1e8;
  buf_2d *local_1e0;
  MACROBLOCKD *local_1d8;
  PICK_MODE_CONTEXT **local_1d0;
  ModeCosts *local_1c0;
  PICK_MODE_CONTEXT **cur_part_ctxs [4];
  int ab_partitions_allowed [4];
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  
  iVar22 = best_rdc.rdcost;
  pSVar6 = (cpi->common).seq_params;
  uVar2 = pSVar6->monochrome;
  local_560[0] = (ulong)bsize;
  part_search_state.part_blk_params.mi_step =
       (int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [local_560[0]] >> 1);
  iVar48 = part_search_state.part_blk_params.mi_step + mi_row;
  local_534 = part_search_state.part_blk_params.mi_step + mi_col;
  part_search_state.part_blk_params.width = (int)block_size_wide[local_560[0]];
  part_search_state.part_blk_params.min_partition_size_1d =
       (int)block_size_wide[(td->mb).sb_enc.min_partition_size];
  part_search_state.part_blk_params.subsize = BLOCK_INVALID;
  switch(local_560[0]) {
  case 0:
    uVar40 = local_560[0];
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
    goto switchD_001ecbdc_caseD_1;
  case 3:
    uVar40 = 1;
    break;
  case 6:
    uVar40 = 2;
    break;
  case 9:
    uVar40 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar40 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001ecbdc_caseD_1;
      uVar40 = 5;
    }
  }
  part_search_state.part_blk_params.subsize = subsize_lookup[3][uVar40];
switchD_001ecbdc_caseD_1:
  uVar40 = (ulong)(BLOCK_8X4 < bsize);
  part_search_state.part_blk_params.bsize_at_least_8x8 = (int)(BLOCK_8X4 < bsize);
  part_search_state.part_blk_params.bsize = bsize;
  iVar27 = (cpi->common).mi_params.mi_rows;
  part_search_state.part_blk_params.has_rows = (int)(iVar48 < iVar27);
  local_51c = (cpi->common).mi_params.mi_cols;
  part_search_state.part_blk_params.has_cols = (int)(local_534 < local_51c);
  part_search_state.intra_part_info = &(td->mb).part_search_info;
  if ((bsize == BLOCK_64X64) && (((cpi->common).current_frame.frame_type & 0xfd) == 0)) {
    (td->mb).part_search_info.quad_tree_idx = 0;
    (td->mb).part_search_info.cnn_output_valid = 0;
LAB_001eccb5:
    uVar38 = ""[local_560[0]] - 1;
    part_search_state.pl_ctx_idx =
         (uint)(((uint)(int)(td->mb).e_mbd.above_partition_context[mi_col] >> (uVar38 & 0x1f) & 1)
               != 0) +
         ((uint)(int)(td->mb).e_mbd.left_partition_context[mi_row & 0x1f] >> ((byte)uVar38 & 0x1f) &
         1) * 2 + (uint)""[local_560[0]] * 4 + -4;
  }
  else {
    part_search_state.pl_ctx_idx = 0;
    if (BLOCK_8X4 < bsize) goto LAB_001eccb5;
  }
  part_search_state.partition_cost =
       (td->mb).mode_costs.partition_cost[part_search_state.pl_ctx_idx];
  part_search_state.split_part_rect_win[0].rect_part_win[0] = 1;
  part_search_state.split_part_rect_win[0].rect_part_win[1] = 1;
  part_search_state.split_part_rect_win[1].rect_part_win[0] = 1;
  part_search_state.split_part_rect_win[1].rect_part_win[1] = 1;
  part_search_state.split_part_rect_win[2].rect_part_win[0] = 1;
  part_search_state.split_part_rect_win[2].rect_part_win[1] = 1;
  part_search_state.split_part_rect_win[3].rect_part_win[0] = 1;
  part_search_state.split_part_rect_win[3].rect_part_win[1] = 1;
  part_search_state.this_rdc.rate = 0;
  part_search_state.this_rdc.zero_rate = 0;
  part_search_state.this_rdc.dist = 0;
  part_search_state.this_rdc.rdcost = 0;
  part_search_state.this_rdc.sse = 0;
  part_search_state.this_rdc.skip_txfm = '\x01';
  part_search_state.none_rd = 0;
  part_search_state.split_rd[0] = 0;
  part_search_state.split_rd[1] = 0;
  part_search_state.split_rd[2] = 0;
  part_search_state.split_rd[3] = 0;
  part_search_state.rect_part_rd[0][0] = 0;
  part_search_state.rect_part_rd[0][1] = 0;
  part_search_state.rect_part_rd[1][0] = 0;
  part_search_state.rect_part_rd[1][1] = 0;
  part_search_state.is_split_ctx_is_ready[0] = 0;
  part_search_state.is_split_ctx_is_ready[1] = 0;
  part_search_state.is_rect_ctx_is_ready[0] = 0;
  part_search_state.is_rect_ctx_is_ready[1] = 0;
  part_search_state.ss_x = (td->mb).e_mbd.plane[1].subsampling_x;
  part_search_state.ss_y = (td->mb).e_mbd.plane[1].subsampling_y;
  part_search_state.partition_rect_allowed[0] = 0;
  part_search_state.terminate_partition_search = 0;
  if ((cpi->oxcf).part_cfg.enable_rect_partitions == false) {
    uVar40 = 0;
  }
  part_search_state.do_rectangular_split = (int)uVar40;
  part_search_state.partition_none_allowed = part_search_state.part_blk_params.has_cols;
  if (iVar27 <= iVar48) {
    part_search_state.partition_none_allowed = part_search_state.partition_rect_allowed[0];
  }
  part_search_state.prune_rect_part[0] = 0;
  part_search_state.prune_rect_part[1] = 0;
  uVar52 = (ulong)bsize;
  if (part_search_state.do_rectangular_split == 0) {
    part_search_state.partition_rect_allowed[0] = 0;
    part_search_state.partition_rect_allowed[1] = 0;
  }
  else {
    if (local_534 < local_51c) {
      uVar57 = 0xff;
      switch(uVar52) {
      case 0:
        uVar57 = uVar52;
        break;
      case 1:
      case 2:
      case 4:
      case 5:
      case 7:
      case 8:
        goto switchD_001ece23_caseD_1;
      case 3:
        uVar57 = 1;
        break;
      case 6:
        uVar57 = 2;
        break;
      case 9:
        uVar57 = 3;
        break;
      default:
        if (bsize == BLOCK_64X64) {
          uVar57 = 4;
        }
        else {
          if (bsize != BLOCK_128X128) goto switchD_001ece23_caseD_1;
          uVar57 = 5;
        }
      }
      uVar57 = (ulong)subsize_lookup[1][uVar57];
switchD_001ece23_caseD_1:
      part_search_state.partition_rect_allowed[0] =
           (int)(av1_ss_size_lookup[uVar57][part_search_state.ss_x][part_search_state.ss_y] !=
                BLOCK_INVALID);
    }
    part_search_state.partition_rect_allowed[1] = 0;
    if (iVar27 <= iVar48) goto LAB_001ecf1e;
    uVar57 = 0xff;
    switch(uVar52) {
    case 0:
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
      goto switchD_001ecebe_caseD_1;
    case 3:
      uVar52 = 1;
      break;
    case 6:
      uVar52 = 2;
      break;
    case 9:
      uVar52 = 3;
      break;
    default:
      if (bsize == BLOCK_64X64) {
        uVar52 = 4;
      }
      else {
        if (bsize != BLOCK_128X128) goto switchD_001ecebe_caseD_1;
        uVar52 = 5;
      }
    }
    uVar57 = (ulong)subsize_lookup[2][uVar52];
switchD_001ecebe_caseD_1:
    part_search_state.partition_rect_allowed[1] =
         (int)(av1_ss_size_lookup[uVar57][part_search_state.ss_x][part_search_state.ss_y] !=
              BLOCK_INVALID);
  }
LAB_001ecf1e:
  part_search_state.found_best_partition = false;
  if (sms_tree != (SIMPLE_MOTION_DATA_TREE *)0x0) {
    sms_tree->partitioning = '\0';
  }
  if (best_rdc.rdcost < 0) {
    rd_cost->rate = 0x7fffffff;
    rd_cost->zero_rate = 0;
    rd_cost->dist = 0x7fffffffffffffff;
    rd_cost->rdcost = 0x7fffffffffffffff;
    rd_cost->sse = 0x7fffffffffffffff;
    rd_cost->skip_txfm = '\0';
    return false;
  }
  if (pSVar6->sb_size == bsize) {
    (td->mb).must_find_valid_partition = 0;
  }
  if (none_rd != (int64_t *)0x0) {
    *none_rd = 0;
  }
  local_570 = td;
  local_568 = cpi;
  local_528 = tile_data;
  part_search_state.part_blk_params.mi_row = mi_row;
  part_search_state.part_blk_params.mi_col = mi_col;
  part_search_state.part_blk_params.mi_row_edge = iVar48;
  part_search_state.part_blk_params.mi_col_edge = local_534;
  part_search_state.part_blk_params.split_bsize2 = part_search_state.part_blk_params.subsize;
  part_search_state.do_square_split = part_search_state.part_blk_params.bsize_at_least_8x8;
  if (iVar27 <= iVar48 || local_51c <= local_534) {
    piVar54 = part_search_state.tmp_partition_cost;
    part_search_state.tmp_partition_cost[0] = 0x1e00;
    pFVar7 = (cpi->common).fc;
    part_search_state.tmp_partition_cost[1] = part_search_state.tmp_partition_cost[0];
    part_search_state.tmp_partition_cost[2] = part_search_state.tmp_partition_cost[0];
    if (local_534 < local_51c) {
      aVar5 = pFVar7->partition_cdf[part_search_state.pl_ctx_idx][2];
      sVar37 = (((aVar5 - pFVar7->partition_cdf[part_search_state.pl_ctx_idx][1]) +
                pFVar7->partition_cdf[part_search_state.pl_ctx_idx][4]) -
               (aVar5 + pFVar7->partition_cdf[part_search_state.pl_ctx_idx][5])) +
               pFVar7->partition_cdf[part_search_state.pl_ctx_idx][7] + -0x8000;
      if (bsize != BLOCK_128X128) {
        sVar37 = (sVar37 - pFVar7->partition_cdf[part_search_state.pl_ctx_idx][8]) +
                 pFVar7->partition_cdf[part_search_state.pl_ctx_idx][9];
      }
      inv_map = (int *)&set_partition_cost_for_edge_blk_bot_inv_map;
    }
    else {
      if (iVar27 <= iVar48) {
        part_search_state.tmp_partition_cost[3] = 0;
        part_search_state.partition_cost = piVar54;
        goto LAB_001ed0e8;
      }
      sVar37 = ((pFVar7->partition_cdf[part_search_state.pl_ctx_idx][1] -
                 pFVar7->partition_cdf[part_search_state.pl_ctx_idx][0] ^ 0x8000) -
               pFVar7->partition_cdf[part_search_state.pl_ctx_idx][2]) +
               pFVar7->partition_cdf[part_search_state.pl_ctx_idx][6];
      if (bsize != BLOCK_128X128) {
        sVar37 = (sVar37 - pFVar7->partition_cdf[part_search_state.pl_ctx_idx][7]) +
                 pFVar7->partition_cdf[part_search_state.pl_ctx_idx][8];
      }
      inv_map = (int *)&set_partition_cost_for_edge_blk_rhs_inv_map;
    }
    x_ctx.a._0_2_ = -0x8000 - sVar37;
    x_ctx.a[2] = '\0';
    x_ctx.a[3] = '\0';
    part_search_state.tmp_partition_cost[3] = part_search_state.tmp_partition_cost[0];
    av1_cost_tokens_from_cdf(piVar54,(aom_cdf_prob *)&x_ctx,inv_map);
    part_search_state.partition_cost = piVar54;
  }
LAB_001ed0e8:
  pAVar65 = local_568;
  if ((local_568->sf).part_sf.use_square_partition_only_threshold < (BLOCK_SIZE)local_560[0]) {
    part_search_state.partition_rect_allowed[0] = part_search_state.partition_rect_allowed[0] & 1;
    if (iVar48 < iVar27) {
      part_search_state.partition_rect_allowed[0] = 0;
    }
    part_search_state.partition_rect_allowed[1] = part_search_state.partition_rect_allowed[1] & 1;
    if (local_534 < local_51c) {
      part_search_state.partition_rect_allowed[1] = 0;
    }
  }
  av1_set_offsets(local_568,&local_528->tile_info,&local_570->mb,mi_row,mi_col,bsize);
  pTVar14 = local_570;
  if (((pAVar65->oxcf).mode == '\x02') &&
     (((pAVar65->common).seq_params)->sb_size == (BLOCK_SIZE)local_560[0])) {
    log_sub_block_var((AV1_COMP *)pAVar65->ppi->fn_ptr[0].vf,&local_570->mb,bsize,(double *)&x_ctx,
                      &var_max);
    (pTVar14->mb).intra_sb_rdmult_modifier = 0x80;
    dVar70 = (double)CONCAT44(x_ctx.a._4_4_,CONCAT22(x_ctx.a._2_2_,x_ctx.a._0_2_));
    if ((dVar70 < 2.0) && (4.0 < var_max)) {
      dVar70 = var_max - dVar70;
      iVar48 = 0x50;
      if (dVar70 <= 8.0) {
        iVar48 = 0x80 - (int)(dVar70 * 6.0);
      }
      (local_570->mb).intra_sb_rdmult_modifier = iVar48;
    }
  }
  part_none_rd = (BLOCK_SIZE *)0x7fffffffffffffff;
  setup_block_rdmult(pAVar65,&local_570->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  puVar66 = (uint *)local_570;
  if (((ulong)(uint)best_rdc.rate == 0x7fffffff) ||
     (iVar22 == 0x7fffffffffffffff || best_rdc.dist == 0x7fffffffffffffff)) {
    best_rdc.rate = 0x7fffffff;
    best_rdc.zero_rate = 0;
    best_rdc.dist = 0x7fffffffffffffff;
    best_rdc.rdcost = 0x7fffffffffffffff;
    best_rdc.sse = 0x7fffffffffffffff;
    best_rdc.skip_txfm = '\0';
  }
  else {
    lVar53 = (long)(local_570->mb).rdmult;
    if (best_rdc.rate < 0) {
      best_rdc.rdcost =
           best_rdc.dist * 0x80 - ((long)((ulong)(uint)-best_rdc.rate * lVar53 + 0x100) >> 9);
    }
    else {
      best_rdc.rdcost =
           best_rdc.dist * 0x80 + ((long)((ulong)(uint)best_rdc.rate * lVar53 + 0x100) >> 9);
    }
  }
  local_298 = &(local_570->mb).sb_enc;
  if (((char)local_560[0] == '\x06') && (pAVar65->vaq_refresh != 0)) {
    iVar48 = av1_log_block_var(pAVar65,&local_570->mb,BLOCK_16X16);
    (((ThreadData_conflict *)puVar66)->mb).mb_energy = iVar48;
  }
  local_1d8 = &(((ThreadData_conflict *)puVar66)->mb).e_mbd;
  local_1c0 = &(((ThreadData_conflict *)puVar66)->mb).mode_costs;
  (((ThreadData_conflict *)puVar66)->mb).e_mbd.above_txfm_context =
       (pAVar65->common).above_contexts.txfm[(local_528->tile_info).tile_row] + mi_col;
  (((ThreadData_conflict *)puVar66)->mb).e_mbd.left_txfm_context =
       (((ThreadData_conflict *)puVar66)->mb).e_mbd.left_txfm_context_buffer + (mi_row & 0x1f);
  av1_save_context((MACROBLOCK *)puVar66,&x_ctx,mi_row,mi_col,bsize,(uint)(uVar2 == '\0') * 2 + 1);
  av1_prune_partitions_before_search(pAVar65,(MACROBLOCK *)puVar66,sms_tree,&part_search_state);
  av1_prune_partitions_by_max_min_bsize(local_298,&part_search_state);
  local_210 = &best_rdc.field_0x21;
  local_288 = pc_tree->horizontal + 1;
  local_290 = pc_tree->vertical + 1;
  local_1e0 = &(((ThreadData_conflict *)puVar66)->mb).plane[0].src;
  local_1e8 = pc_tree->horizontala;
  local_1f0 = pc_tree->horizontalb;
  local_1f8 = pc_tree->verticala;
  local_200 = pc_tree->verticalb;
  local_208 = pc_tree->horizontal4;
  local_1d0 = pc_tree->vertical4;
  plVar45 = (long *)(local_580 + 8);
  plVar44 = (long *)(local_580 + 8);
  if ((((ThreadData_conflict *)puVar66)->mb).must_find_valid_partition == 0) goto LAB_001ed690;
LAB_001ed4a0:
  part_none_rd = (BLOCK_SIZE *)0x7fffffffffffffff;
  rect_part_win_info_00 = (RD_RECT_PART_WIN_INFO *)(ulong)*(uint *)((long)plVar45 + 0xd4);
  puVar61 = (uint *)(ulong)*(uint *)((long)plVar45 + 0xd8);
  uVar40 = (ulong)*(uint *)((long)plVar45 + 0xdc);
  tp_00 = (uint *)(ulong)*(uint *)((long)plVar45 + 0xe0);
  uVar52 = (ulong)*(uint *)((long)plVar45 + 0xe4);
  puVar31 = (uint8_t *)(ulong)*(byte *)((long)plVar45 + 0xe8);
  td_00 = (uint8_t *)(ulong)*(byte *)((long)plVar45 + 0xe8);
  pAVar50 = (AV1_COMP *)0x0;
  tile_data_01 = (AV1_COMP *)0x0;
  if (*(uint *)((long)plVar45 + 0xdc) != 0) {
    tile_data_01 = (AV1_COMP *)
                   (ulong)(byte)((int)*(uint *)((long)plVar45 + 0xd8) <
                                 (int)*(uint *)((long)plVar45 + 0xd4) &
                                (pAVar65->oxcf).part_cfg.enable_rect_partitions);
  }
LAB_001ed4eb:
  iVar48 = (int)uVar40;
  bVar69 = (int)tp_00 != 0;
  uVar40 = CONCAT71((int7)(uVar40 >> 8),bVar69);
  *(uint *)((long)plVar45 + 0x1e4) =
       (uint)((int)puVar61 < (int)rect_part_win_info_00 && iVar48 != 0);
  *(uint *)((long)plVar45 + 0x1d4) =
       (uint)(((int)uVar52 != 0 && bVar69) && (int)puVar61 <= (int)rect_part_win_info_00);
  if ((int)uVar52 == 0) goto LAB_001ed5b6;
  bVar69 = (char)tile_data_01 == '\0';
switchD_001ef166_caseD_17:
  if (bVar69) goto LAB_001ed5b6;
  pAVar50 = (AV1_COMP *)0xff;
switchD_001ef166_caseD_14:
  uVar38 = (uint)puVar31;
  if (9 < uVar38) {
    if (uVar38 != 0xc) {
      if (uVar38 != 0xf) goto switchD_001ed552_caseD_1ed58c;
      td_00 = (uint8_t *)0x5;
      goto switchD_001ed552_caseD_1ed580;
    }
    td_00 = &DAT_00000004;
    goto switchD_001ed552_caseD_1ed580;
  }
code_r0x001ed541:
  switch((long)&switchD_001ed552::switchdataD_004e4da8 +
         (long)(int)(&switchD_001ed552::switchdataD_004e4da8)[(ulong)puVar31 & 0xffffffff]) {
  case 0x1ed555:
    goto switchD_001ed552_caseD_1ed555;
  case 0x1ed56d:
    td_00 = (uint8_t *)0x3;
    break;
  case 0x1ed574:
    td_00 = (uint8_t *)0x2;
    break;
  case 0x1ed58c:
    goto switchD_001ed552_caseD_1ed58c;
  }
switchD_001ed552_caseD_1ed580:
  pAVar50 = (AV1_COMP *)
            (ulong)*(byte *)((long)(((ThreadData_conflict *)((long)td_00 + 0x4dcc00))->mb).
                                   mode_costs.wedge_idx_cost[0] + 0xe);
switchD_001ed552_caseD_1ed58c:
  pAVar50 = (AV1_COMP *)
            (ulong)(av1_ss_size_lookup[(long)pAVar50][*(int *)((long)plVar45 + 0x1f0)]
                    [*(int *)((long)plVar45 + 500)] != BLOCK_INVALID);
LAB_001ed5b6:
  *(int *)((long)plVar45 + 0x1d8) = (int)pAVar50;
  uVar38 = 0;
  if (((int)tp_00 != 0 & (byte)tile_data_01) == 1) {
    uVar52 = 0xff;
    uVar38 = (uint)puVar31;
    if (9 < uVar38) {
      if (uVar38 == 0xc) {
        uVar57 = 4;
      }
      else {
        if (uVar38 != 0xf) goto switchD_001ed5e8_caseD_1;
        uVar57 = 5;
      }
      goto switchD_001ed5e8_caseD_0;
    }
    uVar57 = (ulong)puVar31 & 0xffffffff;
    switch(uVar57) {
    case 0:
      break;
    default:
      goto switchD_001ed5e8_caseD_1;
    case 3:
      uVar57 = 1;
      break;
    case 6:
      uVar57 = 2;
      break;
    case 9:
      uVar57 = 3;
    }
switchD_001ed5e8_caseD_0:
    uVar52 = (ulong)subsize_lookup[2][uVar57];
switchD_001ed5e8_caseD_1:
    uVar38 = (uint)(av1_ss_size_lookup[uVar52][*(int *)((long)plVar45 + 0x1f0)]
                    [*(int *)((long)plVar45 + 500)] != BLOCK_INVALID);
  }
  *(uint *)((long)plVar45 + 0x1dc) = uVar38;
  *(undefined4 *)((long)plVar45 + 0x1d0) = 0;
  *(undefined8 *)((long)plVar45 + -8) = 0x1ed66e;
  av1_prune_partitions_by_max_min_bsize
            (*(SuperBlockEnc **)((long)plVar45 + 0x2e0),
             (PartitionSearchState *)((long)plVar45 + 0xb8));
  plVar44 = plVar45;
  if ((*(char *)((long)plVar45 + 0x18) == '\f') &&
     (((pAVar65->common).current_frame.frame_type & 0xfd) == 0)) {
    **(undefined8 **)((long)plVar45 + 0xb8) = 0;
  }
LAB_001ed690:
  plVar45 = plVar44;
  if ((pAVar65->oxcf).mode == '\x02') {
    bVar69 = false;
    if ((pAVar65->sf).part_sf.prune_rect_part_using_4x4_var_deviation == true) {
      bVar69 = (((ThreadData_conflict *)puVar66)->mb).must_find_valid_partition == 0;
    }
    if (5 < *(byte *)(plVar45 + 3) || bVar69) {
      pAVar50 = (AV1_COMP *)pAVar65->ppi->fn_ptr[0].vf;
      plVar45[-1] = 0x1ed6f4;
      log_sub_block_var(pAVar50,(MACROBLOCK *)puVar66,(BLOCK_SIZE)plVar45[0xe],
                        (double *)(plVar45 + 0x4c),(double *)(plVar45 + 100));
      dVar70 = (double)plVar45[0x4c];
      if (((*(byte *)(plVar45 + 3) < 6) || (0.272 <= dVar70)) ||
         ((double)plVar45[100] - dVar70 <= 3.0)) {
        if ((bVar69) && ((double)plVar45[100] - dVar70 < 3.0)) {
          *(int *)(plVar45 + 0x3c) = 0;
        }
      }
      else {
        plVar45[0x3a] = 0;
        *(int *)((long)plVar45 + 0x1e4) = 1;
      }
      part_none_rd = (BLOCK_SIZE *)0x7fffffffffffffff;
    }
  }
  *(int *)(plVar45 + 9) = *(int *)((long)plVar45 + 0xc4);
  uVar38 = *(uint *)(plVar45 + 0x19);
  pc_tree_00 = (BLOCK_SIZE (*) [2] [2])(ulong)uVar38;
  BVar47 = *(BLOCK_SIZE *)(plVar45 + 0x1d);
  plVar45[0x16] = 0xffffffff;
  pBVar39 = part_none_rd;
  if ((int)plVar45[0x3a] != 0) goto LAB_001ede07;
  if (*(int *)((long)plVar45 + 0x1d4) == 0) goto LAB_001ede07;
  iVar48 = *(int *)((long)plVar45 + 0xdc);
  plVar45[0x4c] = 0x7fffffff;
  plVar45[0x4d] = (long)part_none_rd;
  plVar45[0x4e] = (long)part_none_rd;
  plVar45[0x4f] = (long)part_none_rd;
  *(undefined1 *)(plVar45 + 0x50) = 0;
  if (*(long *)(plVar45[0xb7] + 8) == 0) {
    plVar45[-1] = 0x1ed810;
    pPVar28 = av1_alloc_pmc(pAVar65,BVar47,(PC_TREE_SHARED_BUFFERS *)plVar45[0x4a]);
    *(PICK_MODE_CONTEXT **)(plVar45[0xb7] + 8) = pPVar28;
    if (pPVar28 == (PICK_MODE_CONTEXT *)0x0) {
      paVar8 = (((ThreadData_conflict *)puVar66)->mb).e_mbd.error_info;
      plVar45[-1] = 0x1ed83b;
      aom_internal_error(paVar8,AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
    }
  }
  iVar27 = 0;
  if (*(int *)((long)plVar45 + 0x1d4) != 0) {
    iVar27 = 0;
    if (iVar48 != 0) {
      iVar27 = 0;
      if (*(int *)plVar45[0x2e] != 0x7fffffff) {
        iVar27 = *(int *)plVar45[0x2e];
      }
    }
    if ((((int)plVar45[0xb2] == 0x7fffffff) ||
        (pBVar43 = (BLOCK_SIZE *)plVar45[0xb3], pBVar43 == part_none_rd)) ||
       ((BLOCK_SIZE *)plVar45[0xb4] == part_none_rd)) {
      plVar45[0x4c] = 0x7fffffff;
      plVar45[0x4d] = (long)part_none_rd;
      plVar45[0x4e] = (long)part_none_rd;
      plVar45[0x4f] = (long)part_none_rd;
      *(undefined1 *)(plVar45 + 0x50) = 0;
    }
    else {
      iVar78 = *(int *)(plVar45[1] + 0x4218);
      uVar63 = (int)plVar45[0xb2] - iVar27;
      *(uint *)(plVar45 + 0x4c) = uVar63;
      plVar45[0x4d] = (long)pBVar43;
      if ((int)uVar63 < 0) {
        lVar53 = (long)pBVar43 * 0x80 - ((long)((ulong)-uVar63 * (long)iVar78 + 0x100) >> 9);
      }
      else {
        lVar53 = (long)pBVar43 * 0x80 + ((long)((ulong)uVar63 * (long)iVar78 + 0x100) >> 9);
      }
      plVar45[0x4e] = lVar53;
    }
  }
  lVar53 = *(long *)(plVar45[0xb7] + 8);
  plVar45[-1] = plVar45[0x50];
  *(undefined1 (*) [16])(plVar45 + -3) = *(undefined1 (*) [16])(plVar45 + 0x4e);
  plVar45[-5] = plVar45[0x4c];
  plVar45[-4] = plVar45[0x4d];
  plVar45[-6] = lVar53;
  *(uint *)(plVar45 + -7) = (uint)BVar47;
  *(undefined4 *)(plVar45 + -8) = 0;
  plVar45[-9] = 0x1ed98d;
  pick_sb_modes(pAVar65,(TileDataEnc *)plVar45[10],(MACROBLOCK *)plVar45[1],(int)plVar45[9],uVar38,
                (RD_STATS *)(plVar45 + 0x22),(PARTITION_TYPE)plVar45[-8],
                *(BLOCK_SIZE *)(plVar45 + -7),(PICK_MODE_CONTEXT *)plVar45[-6],
                *(RD_STATS *)(plVar45 + -5));
  uVar63 = *(uint *)(plVar45 + 0x22);
  if ((((ulong)uVar63 == 0x7fffffff) ||
      (pBVar43 = (BLOCK_SIZE *)plVar45[0x23], pBVar43 == part_none_rd)) ||
     ((BLOCK_SIZE *)plVar45[0x24] == part_none_rd)) {
    plVar45[0x22] = 0x7fffffff;
    plVar45[0x23] = (long)part_none_rd;
    plVar45[0x24] = (long)part_none_rd;
    plVar45[0x25] = (long)part_none_rd;
    *(undefined1 *)(plVar45 + 0x26) = 0;
    bVar69 = true;
    puVar46 = (undefined8 *)plVar45[0xb9];
    pBVar43 = part_none_rd;
  }
  else {
    puVar46 = (undefined8 *)plVar45[0xb9];
    if ((int)uVar63 < 0) {
      pBVar43 = (BLOCK_SIZE *)
                ((long)pBVar43 * 0x80 -
                ((long)((ulong)-uVar63 * (long)*(int *)(plVar45[1] + 0x4218) + 0x100) >> 9));
    }
    else {
      pBVar43 = (BLOCK_SIZE *)
                ((long)pBVar43 * 0x80 +
                ((long)((ulong)uVar63 * (long)*(int *)(plVar45[1] + 0x4218) + 0x100) >> 9));
    }
    plVar45[0x24] = (long)pBVar43;
    bVar69 = false;
  }
  plVar45[0x10] = (ulong)BVar47;
  plVar45[0x16] = (ulong)*(uint *)(plVar45[1] + 0x25640);
  if (puVar46 != (undefined8 *)0x0) {
    *puVar46 = pBVar43;
  }
  plVar45[0x2f] = (long)pBVar43;
  paBVar41 = (BLOCK_SIZE (*) [6])part_none_rd;
  if (bVar69) goto LAB_001eddb4;
  if ((pAVar65->sf).inter_sf.prune_ref_frame_for_rect_partitions != 0) {
    cVar36 = *(char *)(*(long *)(plVar45[0xb7] + 8) + 0x10);
    bVar62 = *(byte *)(*(long *)(plVar45[0xb7] + 8) + 0x11);
    if ('\0' < (char)bVar62) {
      if (bVar62 < 5 || '\x04' < cVar36) {
        lVar53 = 0;
        do {
          if ((cVar36 == (&comp_ref0_lut)[lVar53]) && (bVar62 == (&comp_ref1_lut)[lVar53])) {
            cVar36 = (char)lVar53 + '\x14';
            goto LAB_001edaea;
          }
          lVar53 = lVar53 + 1;
        } while (lVar53 != 9);
      }
      cVar36 = bVar62 * '\x04' + cVar36 + -0xd;
    }
LAB_001edaea:
    iVar78 = ((pAVar65->common).seq_params)->mib_size;
    plVar45[-1] = 0x1edb0a;
    av1_update_picked_ref_frames_mask
              ((MACROBLOCK *)plVar45[1],(int)cVar36,(BLOCK_SIZE)plVar45[0x10],iVar78,(int)plVar45[9]
               ,uVar38);
  }
  if (iVar48 == 0) {
    paBVar41 = (BLOCK_SIZE (*) [6])plVar45[0x24];
    if (plVar45[0xb4] <= (long)paBVar41) goto LAB_001edcbf;
    plVar45[0xb6] = plVar45[0x26];
    *(undefined1 (*) [16])(plVar45 + 0xb4) = *(undefined1 (*) [16])(plVar45 + 0x24);
    plVar45[0xb2] = plVar45[0x22];
    plVar45[0xb3] = plVar45[0x23];
    *(undefined1 *)((long)plVar45 + 0x1fc) = 1;
  }
  else {
    lVar53 = plVar45[0x22];
    *(int *)(plVar45 + 0x22) = (int)((long)iVar27 + (long)(int)lVar53);
    paBVar41 = (BLOCK_SIZE (*) [6])
               (plVar45[0x23] * 0x80 +
               ((long)*(int *)(plVar45[1] + 0x4218) * ((long)iVar27 + (long)(int)lVar53) + 0x100 >>
               9));
    plVar45[0x24] = (long)paBVar41;
    if (plVar45[0xb4] <= (long)paBVar41) goto LAB_001edcbf;
    plVar45[0xb6] = plVar45[0x26];
    *(undefined1 (*) [16])(plVar45 + 0xb4) = *(undefined1 (*) [16])(plVar45 + 0x24);
    plVar45[0xb2] = plVar45[0x22];
    plVar45[0xb3] = plVar45[0x23];
    *(undefined1 *)((long)plVar45 + 0x1fc) = 1;
    *(undefined1 *)plVar45[0xb7] = 0;
  }
  plVar44 = (long *)(ulong)*(uint *)(plVar45 + 0x1c);
  pAVar50 = (AV1_COMP *)(ulong)*(uint *)((long)plVar45 + 0xe4);
  puVar66 = (uint *)(ulong)*(byte *)(plVar45 + 0x1d);
  if (((((pAVar65->common).current_frame.frame_type & 0xfd) != 0) &&
      ((int)plVar45[0x3c] != 0 || *(int *)((long)plVar45 + 0x1e4) != 0)) &&
     ((*(int *)(plVar45[1] + 0x2b64 +
               (ulong)(*(ushort *)(**(long **)(plVar45[1] + 0x2058) + 0xa7) & 7) * 4) == 0 &&
      (*(int *)(*(long *)(plVar45[0xb7] + 8) + 0x1a4) != 0)))) {
    if ((pAVar65->sf).part_sf.use_square_partition_only_threshold <=
        (byte)(*(byte *)(plVar45 + 0x1d) - BLOCK_4X8)) goto LAB_001efc99;
    if ((pAVar65->sf).part_sf.ml_predict_breakout_level < 1) goto LAB_001efc99;
    iVar48 = (((MACROBLOCK *)plVar45[1])->e_mbd).bd;
    *(uint *)(plVar45 + 7) = *(uint *)((long)plVar45 + 0xe4);
    plVar45[-1] = 0x1efc95;
    av1_ml_predict_breakout
              (pAVar65,(MACROBLOCK *)plVar45[1],(RD_STATS *)(plVar45 + 0x22),(uint)plVar45[0x16],
               iVar48,(PartitionSearchState *)(plVar45 + 0x17));
    pAVar50 = (AV1_COMP *)(ulong)*(uint *)(plVar45 + 7);
    goto LAB_001efc99;
  }
LAB_001edc44:
  uVar38 = (uint)pc_tree_00;
  if ((((((((pAVar65->sf).part_sf.simple_motion_search_early_term_none != 0) &&
          ((pAVar65->common).show_frame != 0)) &&
         (((pAVar65->common).current_frame.frame_type & 0xfd) != 0)) &&
        ((5 < (byte)puVar66 && ((int)plVar44 != 0)))) && ((int)pAVar50 != 0)) &&
      (((BLOCK_SIZE *)plVar45[0x24] < part_none_rd && (*(uint *)(plVar45 + 0x22) < 0x7fffffff)))) &&
     ((int)plVar45[0x3c] != 0 || *(int *)((long)plVar45 + 0x1e4) != 0)) {
    plVar45[-1] = 0x1edcbf;
    av1_simple_motion_search_early_term_none
              (pAVar65,(MACROBLOCK *)plVar45[1],(SIMPLE_MOTION_DATA_TREE *)plVar45[0xb8],
               (RD_STATS *)(plVar45 + 0x22),(PartitionSearchState *)(plVar45 + 0x17));
  }
LAB_001edcbf:
  pBVar39 = part_none_rd;
  if ((pAVar65->sf).part_sf.prune_rect_part_using_none_pred_mode == true) {
    bVar62 = *(byte *)(*(long *)(plVar45[0xb7] + 8) + 2);
    if (bVar62 < 10) {
      if ((0xc4U >> (bVar62 & 0x1f) & 1) == 0) {
        if ((0x122U >> (bVar62 & 0x1f) & 1) == 0) {
          if ((0x201U >> (bVar62 & 0x1f) & 1) != 0) {
            lVar53 = plVar45[1];
            if (((*(char *)(lVar53 + 0x2061) == '\x01') &&
                ((uint)block_size_wide[plVar45[0x10]] * (uint)block_size_high[plVar45[0x10]] <
                 (uint)block_size_wide[**(byte **)(lVar53 + 0x2068)] *
                 (uint)block_size_high[**(byte **)(lVar53 + 0x2068)])) ||
               ((*(char *)(lVar53 + 0x2060) == '\x01' &&
                ((uint)block_size_wide[plVar45[0x10]] * (uint)block_size_high[plVar45[0x10]] <
                 (uint)block_size_wide[**(byte **)(lVar53 + 0x2070)] *
                 (uint)block_size_high[**(byte **)(lVar53 + 0x2070)])))) {
              plVar45[0x3d] = 0x100000001;
            }
          }
        }
        else {
          *(int *)(plVar45 + 0x3d) = 1;
        }
      }
      else {
        *(int *)((long)plVar45 + 0x1ec) = 1;
      }
    }
  }
LAB_001eddb4:
  bVar69 = ((pAVar65->common).seq_params)->monochrome == '\0';
  puVar66 = (uint *)plVar45[1];
  plVar45[-1] = 0x1edded;
  av1_restore_context((MACROBLOCK *)puVar66,(RD_SEARCH_MACROBLOCK_CONTEXT *)(plVar45 + 0x7f),
                      (int)plVar45[9],uVar38,(BLOCK_SIZE)plVar45[0x10],bVar69 + 1 + (uint)bVar69);
  BVar47 = *(BLOCK_SIZE *)(plVar45 + 0x1d);
  *(int *)(plVar45 + 9) = *(int *)((long)plVar45 + 0xc4);
  uVar38 = *(uint *)(plVar45 + 0x19);
  part_none_rd = *paBVar41;
LAB_001ede07:
  *(int *)(plVar45 + 0xf) = (int)plVar45[0x18];
  *(int *)((long)plVar45 + 0x323) = *(int *)((long)plVar45 + 0x15c);
  *(int *)(plVar45 + 100) = *(int *)((long)plVar45 + 0x159);
  uVar52 = (ulong)BVar47;
  BVar24 = BLOCK_INVALID;
  plVar45[0x76] = uVar52;
  switch(uVar52) {
  case 0:
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
    goto switchD_001ede53_caseD_1;
  case 3:
    uVar52 = 1;
    break;
  case 6:
    uVar52 = 2;
    break;
  case 9:
    uVar52 = 3;
    break;
  default:
    if (BVar47 == BLOCK_64X64) {
      uVar52 = 4;
    }
    else {
      if (BVar47 != BLOCK_128X128) goto switchD_001ede53_caseD_1;
      uVar52 = 5;
    }
  }
  BVar24 = subsize_lookup[3][uVar52];
switchD_001ede53_caseD_1:
  pBVar43 = pBVar39;
  if (((int)plVar45[0x3a] == 0) && (*(int *)((long)plVar45 + 0x1e4) != 0)) {
    *(uint *)((long)plVar45 + 0x24) = uVar38;
    *(uint *)(plVar45 + 0x10) = (uint)BVar24;
    lVar42 = 0;
    lVar53 = plVar45[0xb7];
    do {
      pPVar29 = *(PC_TREE **)(lVar53 + 0xd0 + lVar42 * 8);
      if (pPVar29 == (PC_TREE *)0x0) {
        plVar45[-1] = 0x1edee5;
        pPVar29 = av1_alloc_pc_tree_node((BLOCK_SIZE)(int)plVar45[0x10]);
        *(PC_TREE **)(lVar53 + 0xd0 + lVar42 * 8) = pPVar29;
        if (pPVar29 == (PC_TREE *)0x0) {
          paVar8 = (((ThreadData_conflict *)puVar66)->mb).e_mbd.error_info;
          plVar45[-1] = 0x1edf08;
          aom_internal_error(paVar8,AOM_CODEC_MEM_ERROR,"Failed to allocate PC_TREE");
          pPVar29 = *(PC_TREE **)(lVar53 + 0xd0 + lVar42 * 8);
        }
      }
      pPVar29->index = (int)lVar42;
      lVar42 = lVar42 + 1;
    } while (lVar42 != 4);
    *(BLOCK_SIZE *)(plVar45 + 5) = BVar47;
    plVar45[0x47] = (long)part_none_rd;
    iVar48 = *(int *)(plVar45[0x2e] + 0xc);
    uVar57 = (ulong)(((ThreadData_conflict *)puVar66)->mb).rdmult;
    pBVar43 = (BLOCK_SIZE *)((long)(uVar57 * (long)iVar48 + 0x100) >> 9);
    plVar45[7] = plVar45[0xb4];
    *(int *)(plVar45 + 0x41) = (int)plVar45[0xb2];
    plVar45[0x40] = plVar45[0xb3];
    uVar26 = 1;
    uVar68 = 0;
    plVar44 = plVar45 + 0x30;
    plVar45[6] = 0;
    lVar53 = 0;
    iVar27 = *(int *)((long)plVar45 + 0x24);
    iVar78 = (int)plVar45[9];
    uVar40 = (ulong)*(uint *)(plVar45 + 0xf);
    uVar52 = (long)iVar48;
    do {
      lVar42 = plVar45[7];
      if (lVar42 <= (long)pBVar43) {
        puVar66 = (uint *)plVar45[1];
        pAVar65 = (AV1_COMP *)plVar45[2];
        goto LAB_001ee3e3;
      }
      uVar58 = uVar52 & 0xffffffff;
      iVar48 = ((uint)(uVar68 >> 1) & 0x7fffffff) * (int)uVar40 + iVar78;
      pAVar65 = (AV1_COMP *)plVar45[2];
      iVar49 = (int)uVar52;
      if (iVar48 < (pAVar65->common).mi_params.mi_rows) {
        iVar56 = 0;
        if ((uVar68 & 1) != 0) {
          iVar56 = (int)uVar40;
        }
        if (iVar56 + iVar27 < (pAVar65->common).mi_params.mi_cols) {
          lVar51 = *(long *)(plVar45[0xb7] + 0xd0 + uVar68 * 8);
          *(int *)(lVar51 + 0xf0) = (int)uVar68;
          lVar9 = plVar45[0xb8];
          if (((((int)plVar45[0x41] == 0x7fffffff) || (iVar49 == 0x7fffffff)) ||
              (lVar42 == 0x7fffffffffffffff)) ||
             ((plVar45[0x40] == 0x7fffffffffffffff || (plVar45[6] == 0x7fffffffffffffff)))) {
            plVar45[0x4c] = 0x7fffffff;
            plVar45[0x4d] = 0x7fffffffffffffff;
            plVar45[0x4e] = 0x7fffffffffffffff;
            plVar45[0x4f] = 0x7fffffffffffffff;
            *(undefined1 *)(plVar45 + 0x50) = 0;
          }
          else {
            lVar42 = plVar45[0x40] - plVar45[6];
            uVar38 = (int)plVar45[0x41] - iVar49;
            *(uint *)(plVar45 + 0x4c) = uVar38;
            plVar45[0x4d] = lVar42;
            if ((int)uVar38 < 0) {
              lVar42 = lVar42 * 0x80 - ((long)((ulong)-uVar38 * (long)(int)uVar57 + 0x100) >> 9);
            }
            else {
              lVar42 = lVar42 * 0x80 + ((long)((ulong)uVar38 * (long)(int)uVar57 + 0x100) >> 9);
            }
            plVar45[0x4e] = lVar42;
          }
          iVar78 = 0;
          if ((*(byte *)(plVar45 + 5) < 0xd) &&
             (iVar78 = 0, (*(byte *)(plVar45[2] + 0x3bf80) & 0xfd) == 0)) {
            iVar78 = *(int *)plVar45[0x17];
            *(int *)plVar45[0x17] = (int)uVar68 + iVar78 * 4 + 1;
          }
          if (lVar9 == 0) {
            lVar42 = 0;
          }
          else {
            lVar42 = *(long *)(lVar9 + 8 + uVar68 * 8);
          }
          plVar45[-6] = plVar45[0x50];
          *(undefined1 (*) [16])(plVar45 + -8) = *(undefined1 (*) [16])(plVar45 + 0x4e);
          plVar45[-10] = plVar45[0x4c];
          plVar45[-9] = plVar45[0x4d];
          plVar45[-1] = (long)((long)plVar44 + -0x94);
          *(uint *)(plVar45 + -2) = (uint)*(byte *)(plVar45 + 0xba);
          plVar45[-3] = (long)plVar44;
          plVar45[-4] = lVar42;
          plVar45[-5] = lVar51;
          plVar45[-0xb] = (long)(plVar45 + 0x22);
          *(int *)(plVar45 + -0xc) = (int)plVar45[0x10];
          plVar45[-0xd] = 0x1ee1d2;
          _Var25 = av1_rd_pick_partition
                             ((AV1_COMP *)plVar45[2],(ThreadData_conflict *)plVar45[1],
                              (TileDataEnc *)plVar45[10],(TokenExtra **)plVar45[0x15],iVar48,
                              iVar56 + iVar27,*(BLOCK_SIZE *)(plVar45 + -0xc),
                              (RD_STATS *)plVar45[-0xb],*(RD_STATS *)(plVar45 + -10),
                              (PC_TREE *)plVar45[-5],(SIMPLE_MOTION_DATA_TREE *)plVar45[-4],
                              (int64_t *)plVar45[-3],(SB_MULTI_PASS_MODE)plVar45[-2],
                              (RD_RECT_PART_WIN_INFO *)plVar45[-1]);
          if (!_Var25) {
            pBVar43 = (BLOCK_SIZE *)0x7fffffffffffffff;
            puVar66 = (uint *)plVar45[1];
            pAVar65 = (AV1_COMP *)plVar45[2];
            iVar27 = *(int *)((long)plVar45 + 0x24);
            iVar78 = (int)plVar45[9];
            goto LAB_001ee3e3;
          }
          if ((*(byte *)(plVar45 + 5) < 0xd) && ((*(byte *)(plVar45[2] + 0x3bf80) & 0xfd) == 0)) {
            *(int *)plVar45[0x17] = iVar78;
          }
          uVar63 = iVar49 + (int)plVar45[0x22];
          uVar38 = *(uint *)(plVar45[1] + 0x4218);
          uVar57 = (ulong)uVar38;
          uVar59 = 0;
          uVar58 = 0x7fffffff;
          if (uVar63 == 0x7fffffff) {
            lVar42 = 0x7fffffffffffffff;
            pBVar43 = (BLOCK_SIZE *)0x7fffffffffffffff;
            plVar45[6] = 0x7fffffffffffffff;
            iVar27 = *(int *)((long)plVar45 + 0x24);
            iVar78 = (int)plVar45[9];
            uVar40 = (ulong)*(uint *)(plVar45 + 0xf);
          }
          else {
            lVar51 = plVar45[6] + plVar45[0x23];
            pBVar43 = (BLOCK_SIZE *)0x7fffffffffffffff;
            plVar45[6] = 0x7fffffffffffffff;
            iVar27 = *(int *)((long)plVar45 + 0x24);
            iVar78 = (int)plVar45[9];
            uVar40 = (ulong)*(uint *)(plVar45 + 0xf);
            lVar42 = 0x7fffffffffffffff;
            uVar59 = 0;
            if (lVar51 != 0x7fffffffffffffff) {
              if ((int)uVar63 < 0) {
                pBVar43 = (BLOCK_SIZE *)
                          (lVar51 * 0x80 - ((long)((long)(int)uVar38 * (ulong)-uVar63 + 0x100) >> 9)
                          );
              }
              else {
                pBVar43 = (BLOCK_SIZE *)
                          (lVar51 * 0x80 + ((long)((long)(int)uVar38 * (ulong)uVar63 + 0x100) >> 9))
                ;
              }
              uVar58 = (ulong)uVar63;
              plVar45[6] = lVar51;
              lVar42 = lVar53;
              uVar59 = uVar26;
            }
          }
          lVar53 = lVar42;
          uVar26 = uVar59;
          if (((uVar68 < 2) &&
              (((pcVar33 = *(char **)(plVar45[0xb7] + 0xd0 + uVar68 * 8), *(byte *)(plVar45 + 5) < 4
                || (*pcVar33 == '\0')) &&
               (lVar42 = *(long *)(pcVar33 + 8), *(char *)(lVar42 + 0x8e) == '\0')))) &&
             ((*(char *)(lVar42 + 0x8f) == '\0' && (*(char *)(lVar42 + 3) != '\r')))) {
            *(undefined4 *)((long)plVar45 + uVar68 * 4 + 0x1c0) = 1;
          }
        }
        puVar66 = (uint *)plVar45[1];
        pAVar65 = (AV1_COMP *)plVar45[2];
      }
      else {
        puVar66 = (uint *)plVar45[1];
      }
      uVar68 = uVar68 + 1;
      plVar44 = plVar44 + 1;
      uVar52 = uVar58;
    } while (uVar68 != 4);
    uVar68 = 4;
    uVar40 = plVar45[7];
    if ((long)pBVar43 < (long)uVar40) {
      lVar42 = plVar45[6] * 0x80 + ((long)(int)uVar57 * (long)(int)uVar58 + 0x100 >> 9);
      BVar47 = *(BLOCK_SIZE *)(plVar45 + 5);
      if (lVar42 < (long)uVar40) {
        *(int *)(plVar45 + 0xb2) = (int)uVar58;
        *(int *)((long)plVar45 + 0x594) = 0;
        plVar45[0xb3] = plVar45[6];
        plVar45[0xb4] = lVar42;
        plVar45[0xb5] = lVar53;
        *(undefined1 *)(plVar45 + 0xb6) = uVar26;
        lVar53 = plVar45[100];
        piVar54 = (int *)plVar45[0x6d];
        *(undefined4 *)((long)piVar54 + 3) = *(undefined4 *)((long)plVar45 + 0x323);
        *piVar54 = (int)lVar53;
        *(undefined1 *)((long)plVar45 + 0x1fc) = 1;
        *(undefined1 *)plVar45[0xb7] = 3;
      }
      part_none_rd = (BLOCK_SIZE *)plVar45[0x47];
    }
    else {
LAB_001ee3e3:
      BVar47 = *(BLOCK_SIZE *)(plVar45 + 5);
      iVar48 = (pAVar65->sf).part_sf.less_rectangular_check_level;
      part_none_rd = (BLOCK_SIZE *)plVar45[0x47];
      if ((0 < iVar48) && ((uint)uVar68 < 3 || iVar48 == 2)) {
        *(uint *)(plVar45 + 0x3c) =
             *(uint *)(plVar45 + 0x3c) & (uint)((long)pBVar43 <= plVar45[0x2f] || plVar45[0x2f] < 1)
        ;
      }
    }
    pSVar6 = (pAVar65->common).seq_params;
    if ((BVar47 <= (((ThreadData_conflict *)puVar66)->mb).sb_enc.max_partition_size) ||
       (BVar47 == pSVar6->sb_size)) {
      bVar69 = pSVar6->monochrome == '\0';
      plVar45[-1] = 0x1ee47c;
      av1_restore_context((MACROBLOCK *)puVar66,(RD_SEARCH_MACROBLOCK_CONTEXT *)(plVar45 + 0x7f),
                          iVar78,iVar27,(BLOCK_SIZE)plVar45[0x76],bVar69 + 1 + (uint)bVar69);
    }
    pBVar39 = (BLOCK_SIZE *)0x7fffffffffffffff;
  }
  if ((((part_none_rd == pBVar39) && ((pAVar65->sf).part_sf.early_term_after_none_split != 0)) &&
      (pBVar43 == pBVar39)) &&
     (((((ThreadData_conflict *)puVar66)->mb).must_find_valid_partition == 0 &&
      (((pAVar65->common).seq_params)->sb_size != (BLOCK_SIZE)plVar45[3])))) {
    *(int *)(plVar45 + 0x3a) = 1;
  }
  if (((((1 < (pAVar65->sf).part_sf.skip_non_sq_part_based_on_none) &&
        (lVar53 = *(long *)(plVar45[0xb7] + 8), lVar53 != 0)) &&
       (((((ThreadData_conflict *)puVar66)->mb).qindex < 0xc9 &&
        (bVar62 = *(byte *)(lVar53 + 2), 0xf3 < (byte)(bVar62 - 0x19))))) &&
      (((0x18 < bVar62 || ((0x1790000U >> (bVar62 & 0x1f) & 1) == 0)) &&
       (*(int *)(lVar53 + 0x1a4) != 0)))) &&
     ((5 < *(byte *)(plVar45 + 3) &&
      ((((ThreadData_conflict *)puVar66)->mb).must_find_valid_partition == 0)))) {
    *(int *)(plVar45 + 0x3c) = 0;
  }
  iVar48 = *(int *)((long)plVar45 + 0xc4);
  lVar53 = plVar45[0x19];
  BVar47 = *(BLOCK_SIZE *)(plVar45 + 0x1d);
  if ((pAVar65->sf).part_sf.ml_early_term_after_part_split_level == 0) {
LAB_001ee5bb:
    if (((((pAVar65->sf).part_sf.ml_prune_partition != 0) &&
         (((pAVar65->common).current_frame.frame_type & 0xfd) != 0)) &&
        (*(int *)((long)plVar45 + 0x1dc) != 0 || (int)plVar45[0x3b] != 0)) &&
       ((((int)plVar45[0x3d] == 0 && (*(int *)((long)plVar45 + 0x1ec) == 0)) &&
        ((int)plVar45[0x3a] == 0)))) {
      pYVar10 = pAVar65->source;
      bVar69 = ((pAVar65->common).seq_params)->monochrome == '\0';
      plVar45[-1] = 0x1ee636;
      av1_setup_src_planes
                ((MACROBLOCK *)puVar66,pYVar10,iVar48,(int)lVar53,bVar69 + 1 + (uint)bVar69,BVar47);
      plVar45[-1] = 0x1ee664;
      av1_ml_prune_rect_partition
                (pAVar65,(MACROBLOCK *)puVar66,plVar45[0xb4],plVar45[0x2f],plVar45 + 0x30,
                 (PartitionSearchState *)(plVar45 + 0x17));
    }
  }
  else if (((((pAVar65->common).current_frame.frame_type & 0xfd) != 0) && ((int)plVar45[0x3a] == 0))
          && (((int)plVar45[0x3c] != 0 &&
              (*(int *)((long)plVar45 + 0x1dc) != 0 || (int)plVar45[0x3b] != 0)))) {
    plVar45[-1] = (long)(plVar45 + 0x17);
    plVar45[-2] = (long)(plVar45 + 0x30);
    plVar45[-3] = 0x1ee5a5;
    av1_ml_early_term_after_split
              (pAVar65,(MACROBLOCK *)puVar66,(SIMPLE_MOTION_DATA_TREE *)plVar45[0xb8],plVar45[0xb4],
               (int64_t)part_none_rd,(int64_t)pBVar43,(int64_t *)plVar45[-2],
               (PartitionSearchState *)plVar45[-1]);
    if ((pAVar65->sf).part_sf.ml_early_term_after_part_split_level == 0) goto LAB_001ee5bb;
  }
  uVar52 = (ulong)*(byte *)(plVar45 + 0x1d);
  lVar53 = *(long *)*(undefined1 (*) [12])((long)plVar45 + 0xc4);
  iVar48 = (int)((ulong)lVar53 >> 0x20);
  auVar71._12_4_ = iVar48;
  auVar71._0_12_ = *(undefined1 (*) [12])((long)plVar45 + 0xc4);
  pauVar64 = (undefined1 (*) [16])(plVar45 + 0x4c);
  *pauVar64 = auVar71;
  plVar45[0x4e] = lVar53;
  plVar45[0xf] = lVar53;
  *(int *)(plVar45 + 0x4f) = (int)lVar53;
  *(int *)((long)plVar45 + 0x27c) = (int)plVar45[0x1a];
  plVar44 = plVar45 + 0x5f;
  *(int *)plVar44 = (int)plVar45[0x1c];
  *(int *)(plVar45 + 0x58) = *(int *)((long)plVar45 + 0xe4);
  plVar32 = plVar45 + 100;
  *plVar32 = plVar45[0x49];
  plVar45[0x65] = plVar45[0x5e];
  plVar45[0x66] = plVar45[0x48];
  plVar45[0x67] = plVar45[0x5d];
  *(int *)((long)plVar45 + 0x24) = iVar48;
  uVar57 = CONCAT71((uint7)(uint3)((uint)(int)plVar45[0x1a] >> 8),1);
  lVar53 = 0;
  plVar45[5] = uVar52;
  do {
    if ((((int)plVar45[0x3a] == 0) && (*(int *)((long)plVar45 + lVar53 * 4 + 0x1d8) != 0)) &&
       (*(int *)((long)plVar45 + lVar53 * 4 + 0x1e8) == 0)) {
      plVar45[6] = (long)plVar32;
      if ((int)plVar45[0x3c] == 0) {
        iVar48 = *(int *)((long)*pauVar64 + lVar53 * 4);
        pcVar11 = (code *)(&PTR_av1_active_h_edge_005d2980)[lVar53];
        plVar45[-1] = 0x1ee78e;
        iVar48 = (*pcVar11)(plVar45[2],iVar48,(int)plVar45[0x18]);
        uVar52 = plVar45[5];
        if (iVar48 == 0) goto LAB_001ee72e;
      }
      uVar38 = (&DAT_004e5348)[lVar53];
      bVar62 = (byte)uVar38;
      BVar47 = BLOCK_INVALID;
      plVar45[7] = (ulong)bVar62;
      *(int *)(plVar45 + 9) = (int)uVar57;
      plVar45[0x41] = (ulong)uVar38;
      if (bVar62 != 0xff) {
        switch(uVar52 & 0xffffffff) {
        case 0:
          break;
        case 1:
        case 2:
        case 4:
        case 5:
        case 7:
        case 8:
          goto switchD_001ee7e6_caseD_1;
        case 3:
          uVar52 = 1;
          break;
        case 6:
          uVar52 = 2;
          break;
        case 9:
          uVar52 = 3;
          break;
        default:
          if ((int)uVar52 == 0xc) {
            uVar52 = 4;
          }
          else {
            if ((int)uVar52 != 0xf) goto switchD_001ee7e6_caseD_1;
            uVar52 = 5;
          }
        }
        BVar47 = subsize_lookup[plVar45[7]][uVar52];
      }
switchD_001ee7e6_caseD_1:
      *(int *)(plVar45 + 0x27) = 0;
      plVar45[0x28] = 0;
      plVar45[0x29] = 0;
      plVar45[0x2a] = 0;
      *(undefined1 *)(plVar45 + 0x2b) = 1;
      *(int *)((long)plVar45 + 0x13c) = 0;
      plVar45[0x10] = (ulong)BVar47;
      lVar42 = 0;
      bVar69 = true;
      do {
        bVar67 = bVar69;
        plVar32 = (long *)plVar45[lVar53 * 2 + lVar42 + 100];
        if (*plVar32 == 0) {
          plVar45[-1] = 0x1ee8a1;
          pPVar28 = av1_alloc_pmc((AV1_COMP *)plVar45[2],(BLOCK_SIZE)plVar45[0x10],
                                  (PC_TREE_SHARED_BUFFERS *)plVar45[0x4a]);
          *plVar32 = (long)pPVar28;
          if (pPVar28 == (PICK_MODE_CONTEXT *)0x0) {
            paVar8 = *(aom_internal_error_info **)(plVar45[1] + 0x2b90);
            plVar45[-1] = 0x1ee8c8;
            aom_internal_error(paVar8,AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
          }
        }
        lVar42 = 1;
        bVar69 = false;
      } while (bVar67);
      uVar40 = plVar45[7];
      iVar48 = *(int *)(plVar45[0x2e] + (uVar40 & 0xffffffff) * 4);
      *(int *)(plVar45 + 0x27) = iVar48;
      puVar66 = (uint *)plVar45[1];
      plVar45[0x29] =
           (long)(((ThreadData_conflict *)puVar66)->mb).rdmult * (long)iVar48 + 0x100 >> 9;
      puVar46 = *(undefined8 **)plVar45[6];
      pPVar28 = (PICK_MODE_CONTEXT *)*puVar46;
      lVar42 = *(long *)*pauVar64;
      uVar38 = *(uint *)((long)*pauVar64 + 4);
      plVar45[-2] = uVar40;
      plVar45[-3] = plVar45[0x10];
      plVar45[-4] = (ulong)uVar38;
      plVar45[-5] = (ulong)(uint)lVar42;
      plVar45[-6] = 0;
      plVar45[-7] = 0x1ee962;
      rd_pick_rect_partition
                ((AV1_COMP *)plVar45[2],(TileDataEnc *)plVar45[10],(MACROBLOCK *)puVar66,pPVar28,
                 (PartitionSearchState *)(plVar45 + 0x17),(RD_STATS *)(plVar45 + 0xb2),
                 (int)plVar45[-6],(int)plVar45[-5],(int)plVar45[-4],*(BLOCK_SIZE *)(plVar45 + -3),
                 (PARTITION_TYPE)plVar45[-2]);
      lVar42 = plVar45[0x29];
      lVar51 = plVar45[0xb4];
      if (lVar42 < lVar51) {
        uVar52 = plVar45[5];
        if ((int)*plVar44 != 0) {
          plVar45[0x40] = lVar51;
          pPVar28 = (PICK_MODE_CONTEXT *)*puVar46;
          if ((((pPVar28->mic).palette_mode_info.palette_size[0] == '\0') &&
              ((pPVar28->mic).palette_mode_info.palette_size[1] == '\0')) &&
             ((pPVar28->mic).uv_mode != '\r')) {
            *(undefined4 *)((long)plVar45 + lVar53 * 4 + 0x1c8) = 1;
          }
          pAVar65 = (AV1_COMP *)plVar45[2];
          lVar42 = plVar45[0x10];
          BVar47 = (BLOCK_SIZE)lVar42;
          plVar45[-2] = 1;
          plVar45[-3] = 0x1ee9ea;
          av1_update_state(pAVar65,(ThreadData_conflict *)puVar66,pPVar28,(int)plVar45[0xf],
                           *(int *)((long)plVar45 + 0x24),BVar47,(RUN_TYPE)plVar45[-2]);
          tile_data_00 = (TileDataEnc *)plVar45[10];
          plVar45[-1] = 0x1eea12;
          encode_superblock(pAVar65,tile_data_00,(ThreadData_conflict *)puVar66,
                            (TokenExtra **)plVar45[0x15],'\x01',BVar47,(int *)*plVar45);
          pPVar28 = (PICK_MODE_CONTEXT *)**(undefined8 **)(plVar45[6] + 8);
          uVar38 = *(uint *)((long)*pauVar64 + 8);
          uVar63 = *(uint *)((long)*pauVar64 + 0xc);
          plVar45[-2] = plVar45[7];
          plVar45[-3] = lVar42;
          plVar45[-4] = (ulong)uVar63;
          plVar45[-5] = (ulong)uVar38;
          plVar45[-6] = 1;
          plVar45[-7] = 0x1eea58;
          rd_pick_rect_partition
                    (pAVar65,tile_data_00,(MACROBLOCK *)puVar66,pPVar28,
                     (PartitionSearchState *)(plVar45 + 0x17),(RD_STATS *)(plVar45 + 0xb2),
                     (int)plVar45[-6],(int)plVar45[-5],(int)plVar45[-4],
                     *(BLOCK_SIZE *)(plVar45 + -3),(PARTITION_TYPE)plVar45[-2]);
          lVar42 = plVar45[0x29];
          uVar52 = plVar45[5];
          lVar51 = plVar45[0x40];
        }
      }
      else {
        uVar52 = plVar45[5];
      }
      if (lVar42 < lVar51) {
        lVar53 = plVar45[0x28] * 0x80 +
                 ((long)(((ThreadData_conflict *)puVar66)->mb).rdmult * (long)(int)plVar45[0x27] +
                  0x100 >> 9);
        plVar45[0x29] = lVar53;
        lVar42 = plVar45[2];
        if (lVar53 < lVar51) {
          plVar45[0xb6] = plVar45[0x2b];
          *(undefined1 (*) [16])(plVar45 + 0xb4) = *(undefined1 (*) [16])(plVar45 + 0x29);
          plVar45[0xb2] = plVar45[0x27];
          plVar45[0xb3] = plVar45[0x28];
          *(undefined1 *)((long)plVar45 + 0x1fc) = 1;
          *(char *)plVar45[0xb7] = (char)plVar45[0x41];
        }
      }
      else {
        lVar42 = plVar45[2];
        if (plVar45[0xbb] != 0) {
          *(undefined4 *)(plVar45[0xbb] + lVar53 * 4) = 0;
        }
      }
      bVar69 = *(char *)(*(long *)(lVar42 + 0x42008) + 0x4d) == '\0';
      plVar45[-1] = 0x1eeb64;
      av1_restore_context((MACROBLOCK *)puVar66,(RD_SEARCH_MACROBLOCK_CONTEXT *)(plVar45 + 0x7f),
                          (int)plVar45[0xf],*(int *)((long)plVar45 + 0x24),(BLOCK_SIZE)uVar52,
                          bVar69 + 1 + (uint)bVar69);
      uVar57 = (ulong)*(uint *)(plVar45 + 9);
    }
LAB_001ee72e:
    plVar44 = plVar45 + 0x58;
    pauVar64 = (undefined1 (*) [16])(plVar45 + 0x4e);
    plVar32 = plVar45 + 0x66;
    lVar53 = 1;
    uVar68 = uVar57 & 1;
    uVar57 = 0;
  } while (uVar68 != 0);
  pAVar65 = (AV1_COMP *)plVar45[2];
  if ((int)plVar45[0x16] == -1) {
    pYVar10 = pAVar65->source;
    lVar53 = plVar45[0xe];
    plVar45[-1] = 0x1eebb9;
    av1_setup_src_planes
              ((MACROBLOCK *)puVar66,pYVar10,(int)plVar45[0x13],(int)plVar45[0x14],
               *(int *)((long)plVar45 + 0x6c),(BLOCK_SIZE)lVar53);
    plVar45[-1] = 0x1eebd6;
    uVar38 = av1_get_perpixel_variance_facade
                       (pAVar65,(MACROBLOCKD *)plVar45[0x74],(buf_2d *)plVar45[0x73],
                        (BLOCK_SIZE)lVar53,0);
    plVar45[0x16] = CONCAT44(extraout_var,uVar38);
  }
  iVar48 = (((ThreadData_conflict *)puVar66)->mb).must_find_valid_partition;
  if (((*(long *)(plVar45[0xb7] + 8) == 0) ||
      ((pAVar65->sf).part_sf.skip_non_sq_part_based_on_none < 1)) ||
     ((*(byte *)(plVar45 + 3) < 6 || (iVar48 != 0)))) {
LAB_001eec1a:
    bVar62 = 1;
    uVar40 = 0;
  }
  else {
    bVar62 = 0;
    uVar40 = CONCAT71((int7)(uVar40 >> 8),1);
    if (*(int *)(*(long *)(plVar45[0xb7] + 8) + 0x1a4) == 0) goto LAB_001eec1a;
  }
  uVar52 = plVar45[0xb4];
  BVar47 = *(BLOCK_SIZE *)(plVar45 + 0x1d);
  uVar57 = (ulong)BVar47;
  bVar60 = 1;
  if (uVar52 != 0x7fffffffffffffff) {
    BVar24 = (BLOCK_SIZE)*(undefined4 *)&(pAVar65->sf).part_sf.ext_partition_eval_thresh;
    BVar55 = BLOCK_128X128;
    if ((pAVar65->sf).part_sf.ext_part_eval_based_on_cur_best == 0) {
      BVar55 = BVar24;
    }
    if (iVar48 != 0) {
      BVar55 = BVar24;
    }
    if ((byte)(*(char *)plVar45[0xb7] - 1U) < 2) {
      BVar55 = BVar24;
    }
    bVar60 = (*(int *)((long)plVar45 + 0xe4) != 0 &&
             ((int)plVar45[0x1c] != 0 && (int)plVar45[0x3c] != 0)) & bVar62 & BVar55 < BVar47;
  }
  if ((int)plVar45[0x3a] != 0) {
LAB_001ef63b:
    plVar45[0xc] = 0x100000001;
    bVar69 = true;
    if (uVar52 == 0x7fffffffffffffff) goto LAB_001ef9c3;
    BVar24 = (pAVar65->sf).part_sf.ext_partition_eval_thresh;
    BVar55 = BVar24;
    if ((((pAVar65->sf).part_sf.ext_part_eval_based_on_cur_best != 0) &&
        ((((ThreadData_conflict *)puVar66)->mb).must_find_valid_partition == 0)) &&
       (BVar55 = BLOCK_128X128, *(char *)plVar45[0xb7] != '\0')) {
      BVar55 = BVar24;
    }
    bVar62 = 1;
    if ((((int)plVar45[0x3c] != 0) && (BVar55 < BVar47)) && ((int)plVar45[0x1c] != 0)) {
      bVar62 = (byte)uVar40 | *(int *)((long)plVar45 + 0xe4) == 0;
    }
    if (*(int *)((long)plVar45 + 0xd4) <
        (int)plVar45[0x1b] << ((byte)(pAVar65->sf).part_sf.prune_part4_search & 0x1f)) {
      plVar45[0xc] = 0;
      td_00 = (uint8_t *)puVar66;
      goto LAB_001efa43;
    }
    puVar31 = (uint8_t *)
              (ulong)(byte)(bVar62 | (pAVar65->oxcf).part_cfg.enable_1to4_partitions ^ 1U |
                           BVar47 == BLOCK_128X128);
    tp_00 = (uint *)(long)(int)plVar45[0x3e];
    td_00 = (uint8_t *)(long)*(int *)((long)plVar45 + 500);
    puVar61 = (uint *)(plVar45 + 0xc);
    pAVar50 = (AV1_COMP *)0x1;
    lVar53 = 0;
    rect_part_win_info_00 = (RD_RECT_PART_WIN_INFO *)&DAT_004e5316;
    tile_data_01 = (AV1_COMP *)(ulong)BVar47;
    uVar40 = (ulong)(BVar47 - 3);
    pc_tree_00 = av1_ss_size_lookup;
    puVar66 = &switchD_001ef76d::switchdataD_004e4d80;
    goto LAB_001ef73d;
  }
  *(int *)(plVar45 + 0xf) = (int)uVar40;
  uVar26 = *(undefined1 *)((long)plVar45 + 0xea);
  plVar45[0x10] = *(long *)((long)plVar45 + 0xc4);
  plVar45[0x11] = *(long *)((long)plVar45 + 0xcc);
  puVar61 = (uint *)(ulong)bVar60;
  pPVar29 = (PC_TREE *)plVar45[0xb7];
  rect_part_win_info_00 = (RD_RECT_PART_WIN_INFO *)plVar45[0xbb];
  plVar45[-2] = (long)(plVar45 + 0x7c);
  plVar45[-3] = (long)(plVar45 + 0x17);
  plVar45[-4] = (long)puVar61;
  plVar45[-5] = 0x1eed26;
  av1_prune_ab_partitions
            (pAVar65,(MACROBLOCK *)puVar66,pPVar29,(int)plVar45[0x16],uVar52,rect_part_win_info_00,
             SUB81(plVar45[-4],0),(PartitionSearchState *)plVar45[-3],(int *)plVar45[-2]);
  iVar48 = (int)plVar45[0x38];
  *(int *)(plVar45 + 0x58) = iVar48;
  *(undefined8 *)((long)plVar45 + 0x2c4) = *(undefined8 *)((long)plVar45 + 0x1c4);
  *(int *)((long)plVar45 + 0x2cc) = 0;
  *(int *)(plVar45 + 0x5a) = iVar48;
  *(int *)((long)plVar45 + 0x2d4) = 0;
  *(int *)(plVar45 + 0x5b) = *(int *)((long)plVar45 + 0x1cc);
  *(int *)((long)plVar45 + 0x2dc) = 0;
  plVar45[0x78] = plVar45[0x72];
  plVar45[0x79] = plVar45[0x71];
  plVar45[0x7a] = plVar45[0x70];
  plVar45[0x7b] = plVar45[0x6f];
  plVar45[0x66] = plVar45[0x49];
  plVar45[0x6a] = plVar45[0x48];
  if (iVar48 != 0) {
    ppPVar30 = &pPVar29->split[0]->none;
    plVar45[100] = (long)ppPVar30;
    plVar45[0x68] = (long)ppPVar30;
  }
  if ((int)*(undefined8 *)((long)plVar45 + 0x1c4) != 0) {
    plVar45[0x65] = *(long *)(plVar45[0xb7] + 0xd8) + 8;
  }
  *(undefined1 *)((long)plVar45 + 0x214) = uVar26;
  *(undefined1 *)((long)plVar45 + 0x215) = uVar26;
  BVar24 = BLOCK_INVALID;
  uVar68 = uVar57;
  switch(BVar47) {
  case BLOCK_4X4:
    break;
  case BLOCK_4X8:
  case BLOCK_8X4:
  case BLOCK_8X16:
  case BLOCK_16X8:
  case BLOCK_16X32:
  case BLOCK_32X16:
    goto switchD_001eee42_caseD_1;
  case BLOCK_8X8:
    uVar68 = 1;
    break;
  case BLOCK_16X16:
    uVar68 = 2;
    break;
  case BLOCK_32X32:
    uVar68 = 3;
    break;
  default:
    if (BVar47 == BLOCK_64X64) {
      uVar68 = 4;
    }
    else {
      if (BVar47 != BLOCK_128X128) goto switchD_001eee42_caseD_1;
      uVar68 = 5;
    }
  }
  BVar24 = subsize_lookup[4][uVar68];
switchD_001eee42_caseD_1:
  *(BLOCK_SIZE *)((long)plVar45 + 0x216) = BVar24;
  BVar24 = BLOCK_INVALID;
  uVar68 = uVar57;
  switch(BVar47) {
  case BLOCK_4X4:
    break;
  case BLOCK_4X8:
  case BLOCK_8X4:
  case BLOCK_8X16:
  case BLOCK_16X8:
  case BLOCK_16X32:
  case BLOCK_32X16:
    goto switchD_001eeeba_caseD_1;
  case BLOCK_8X8:
    uVar68 = 1;
    break;
  case BLOCK_16X16:
    uVar68 = 2;
    break;
  case BLOCK_32X32:
    uVar68 = 3;
    break;
  default:
    if (BVar47 == BLOCK_64X64) {
      uVar68 = 4;
    }
    else {
      if (BVar47 != BLOCK_128X128) goto switchD_001eeeba_caseD_1;
      uVar68 = 5;
    }
  }
  BVar24 = subsize_lookup[5][uVar68];
switchD_001eeeba_caseD_1:
  *(BLOCK_SIZE *)((long)plVar45 + 0x217) = BVar24;
  auVar71 = pshuflw(ZEXT216(CONCAT11(uVar26,uVar26)),ZEXT216(CONCAT11(uVar26,uVar26)),0);
  *(int *)(plVar45 + 0x43) = auVar71._0_4_;
  BVar24 = BLOCK_INVALID;
  uVar68 = uVar57;
  switch(BVar47) {
  case BLOCK_4X4:
    break;
  case BLOCK_4X8:
  case BLOCK_8X4:
  case BLOCK_8X16:
  case BLOCK_16X8:
  case BLOCK_16X32:
  case BLOCK_32X16:
    goto switchD_001eef2b_caseD_1;
  case BLOCK_8X8:
    uVar68 = 1;
    break;
  case BLOCK_16X16:
    uVar68 = 2;
    break;
  case BLOCK_32X32:
    uVar68 = 3;
    break;
  default:
    if (BVar47 == BLOCK_64X64) {
      uVar68 = 4;
    }
    else {
      if (BVar47 != BLOCK_128X128) goto switchD_001eef2b_caseD_1;
      uVar68 = 5;
    }
  }
  BVar24 = subsize_lookup[6][uVar68];
switchD_001eef2b_caseD_1:
  *(BLOCK_SIZE *)((long)plVar45 + 0x21c) = BVar24;
  BVar24 = BLOCK_INVALID;
  switch(BVar47) {
  case BLOCK_4X4:
    break;
  case BLOCK_4X8:
  case BLOCK_8X4:
  case BLOCK_8X16:
  case BLOCK_16X8:
  case BLOCK_16X32:
  case BLOCK_32X16:
    goto switchD_001eef7f_caseD_1;
  case BLOCK_8X8:
    uVar57 = 1;
    break;
  case BLOCK_16X16:
    uVar57 = 2;
    break;
  case BLOCK_32X32:
    uVar57 = 3;
    break;
  default:
    if (BVar47 == BLOCK_64X64) {
      uVar57 = 4;
    }
    else {
      if (BVar47 != BLOCK_128X128) goto switchD_001eef7f_caseD_1;
      uVar57 = 5;
    }
  }
  BVar24 = subsize_lookup[7][uVar57];
switchD_001eef7f_caseD_1:
  paBVar41 = (BLOCK_SIZE (*) [6])((long)plVar45 + 0x214);
  *(BLOCK_SIZE *)((long)plVar45 + 0x21d) = BVar24;
  *(undefined1 *)((long)plVar45 + 0x21e) = uVar26;
  *(undefined1 *)((long)plVar45 + 0x21f) = uVar26;
  auVar71 = *(undefined1 (*) [16])(plVar45 + 0x10);
  uVar76 = auVar71._0_4_;
  uVar77 = auVar71._4_4_;
  auVar72._0_8_ = auVar71._0_8_;
  auVar72._8_4_ = uVar76;
  auVar72._12_4_ = auVar71._12_4_;
  *(undefined1 (*) [16])(plVar45 + 0x4c) = auVar72;
  plVar45[0x4e] = CONCAT44(uVar77,auVar71._8_4_);
  auVar73._0_12_ = auVar71._0_12_;
  auVar73._12_4_ = uVar77;
  *(undefined1 (*) [16])(plVar45 + 0x4f) = auVar73;
  auVar74._0_8_ = auVar71._8_8_;
  auVar74._8_4_ = uVar76;
  auVar74._12_4_ = uVar77;
  *(undefined1 (*) [16])(plVar45 + 0x51) = auVar74;
  auVar75._4_4_ = uVar77;
  auVar75._0_4_ = auVar71._8_4_;
  auVar75._8_4_ = uVar76;
  auVar75._12_4_ = auVar71._12_4_;
  *(undefined1 (*) [16])(plVar45 + 0x53) = auVar75;
  *(undefined1 (*) [16])(plVar45 + 0x55) = auVar72;
  plVar45[0x10] = (long)((long)plVar45 + 0x264);
  plVar45[0x57] = auVar74._0_8_;
  part_none_rd = (BLOCK_SIZE *)0x0;
  puVar66 = (uint *)plVar45[1];
LAB_001ef033:
  if (*(int *)((long)plVar45 + (long)part_none_rd * 4 + 0x3e0) == 0) goto LAB_001ef500;
  plVar45[7] = (ulong)part_none_rd | 4;
  lVar53 = 0;
  do {
    BVar47 = *(BLOCK_SIZE *)((long)paBVar41 + lVar53);
    td_00 = (uint8_t *)(ulong)BVar47;
    plVar45[-1] = 0x1ef066;
    pAVar50 = pAVar65;
    pPVar28 = av1_alloc_pmc(pAVar65,BVar47,(PC_TREE_SHARED_BUFFERS *)plVar45[0x4a]);
    plVar44 = (long *)plVar45[(long)(part_none_rd + 0x78)];
    plVar44[lVar53] = (long)pPVar28;
    tile_data_01 = extraout_RDX;
    if (pPVar28 == (PICK_MODE_CONTEXT *)0x0) {
      pAVar50 = (AV1_COMP *)(((ThreadData_conflict *)puVar66)->mb).e_mbd.error_info;
      td_00 = (uint8_t *)0x2;
      plVar45[-1] = 0x1ef092;
      aom_internal_error((aom_internal_error_info *)pAVar50,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
      pPVar28 = (PICK_MODE_CONTEXT *)plVar44[lVar53];
      tile_data_01 = extraout_RDX_00;
    }
    pPVar28->rd_mode_is_ready = 0;
    lVar53 = lVar53 + 1;
  } while (lVar53 != 3);
  pc_tree_00 = (BLOCK_SIZE (*) [2] [2])0x3;
  if (((pAVar65->sf).part_sf.reuse_prev_rd_results_for_part_ab != 0) &&
     ((int)plVar45[(long)(part_none_rd + 0x58)] != 0)) {
    pAVar50 = (AV1_COMP *)*plVar44;
    pc_tree_00 = (BLOCK_SIZE (*) [2] [2])((long)part_none_rd * 0x10);
    td_00 = *(uint8_t **)(plVar45 + 100)[(long)part_none_rd * 2];
    plVar45[-1] = 0x1ef0db;
    av1_copy_tree_context((PICK_MODE_CONTEXT *)pAVar50,(PICK_MODE_CONTEXT *)td_00);
    lVar53 = *plVar44;
    *(char *)(lVar53 + 1) = (char)plVar45[7];
    *(undefined4 *)(lVar53 + 0x1d0) = 1;
    tile_data_01 = extraout_RDX_01;
    if (*(int *)((long)plVar45 + (long)part_none_rd * 8 + 0x2c4) != 0) {
      pAVar50 = (AV1_COMP *)plVar44[1];
      td_00 = *(uint8_t **)(plVar45 + (long)part_none_rd * 2)[0x65];
      plVar45[-1] = 0x1ef116;
      av1_copy_tree_context((PICK_MODE_CONTEXT *)pAVar50,(PICK_MODE_CONTEXT *)td_00);
      lVar53 = plVar44[1];
      *(char *)(lVar53 + 1) = (char)plVar45[7];
      *(undefined4 *)(lVar53 + 0x1d0) = 1;
      tile_data_01 = extraout_RDX_02;
    }
  }
  *(undefined1 (*) [16])(plVar45 + 0x44) = (undefined1  [16])0x0;
  plVar45[0x46] = 0;
  if ((pAVar65->sf).part_sf.reuse_best_prediction_for_part_ab == 0) goto LAB_001ef2f9;
  tp_00 = &switchD_001ef166::switchdataD_004e4d70;
  lVar53 = (long)(int)(&switchD_001ef166::switchdataD_004e4d70)[(ulong)part_none_rd & 0xff];
  puVar31 = (uint8_t *)((long)&switchD_001ef166::switchdataD_004e4d70 + lVar53);
  bVar69 = puVar31 == (byte *)0x0;
  cVar36 = (char)((ulong)tile_data_01 >> 8);
  _Var25 = SUB81(puVar31,0);
  iVar48 = (int)puVar31;
  uVar35 = (undefined7)((ulong)puVar31 >> 8);
  iVar27 = (int)plVar44;
  uVar38 = (uint)puVar66;
  switch((ulong)part_none_rd & 0xff) {
  case 0:
    lVar53 = *(long *)(plVar45[0xb7] + 0xd0);
    if (((lVar53 == 0) || (lVar53 = *(long *)(lVar53 + 8), lVar53 == 0)) ||
       (*(int *)(lVar53 + 0x1a8) == 0x7fffffff)) {
      lVar53 = 0;
    }
    plVar45[0x44] = lVar53;
    lVar53 = *(long *)(plVar45[0xb7] + 0xd8);
    if (((lVar53 == 0) || (lVar53 = *(long *)(lVar53 + 8), lVar53 == 0)) ||
       (*(int *)(lVar53 + 0x1a8) == 0x7fffffff)) {
      lVar53 = 0;
    }
    plVar45[0x45] = lVar53;
    plVar32 = (long *)plVar45[0x5e];
    goto LAB_001ef236;
  case 1:
    lVar53 = *(long *)plVar45[0x49];
    lVar42 = plVar45[0xb7];
    if ((lVar53 == 0) || (*(int *)(lVar53 + 0x1a8) == 0x7fffffff)) {
      lVar53 = 0;
    }
    plVar45[0x44] = lVar53;
    lVar53 = *(long *)(lVar42 + 0xe0);
    goto LAB_001ef2aa;
  case 2:
    lVar53 = *(long *)(plVar45[0xb7] + 0xd0);
    if (((lVar53 == 0) || (lVar53 = *(long *)(lVar53 + 8), lVar53 == 0)) ||
       (*(int *)(lVar53 + 0x1a8) == 0x7fffffff)) {
      lVar53 = 0;
    }
    plVar45[0x44] = lVar53;
    lVar53 = *(long *)(plVar45[0xb7] + 0xe0);
    if (((lVar53 == 0) || (lVar53 = *(long *)(lVar53 + 8), lVar53 == 0)) ||
       (*(int *)(lVar53 + 0x1a8) == 0x7fffffff)) {
      lVar53 = 0;
    }
    plVar45[0x45] = lVar53;
    plVar32 = (long *)plVar45[0x5d];
LAB_001ef236:
    lVar53 = *plVar32;
LAB_001ef2de:
    if ((lVar53 == 0) || (*(int *)(lVar53 + 0x1a8) == 0x7fffffff)) {
LAB_001ef2ef:
      lVar53 = 0;
    }
    plVar45[0x46] = lVar53;
LAB_001ef2f9:
    pPVar12 = (((ThreadData_conflict *)puVar66)->mb).e_mbd.above_partition_context;
    plVar45[6] = (ulong)*(uint *)((long)plVar45 + 0xc4);
    plVar45[9] = (ulong)*(byte *)(plVar45 + 0x1d);
    bVar62 = ""[*(byte *)(plVar45 + 0x1d)];
    lVar53 = (ulong)bVar62 - 1;
    plVar45[5] = (long)(int)plVar45[0x19];
    cVar36 = pPVar12[(int)plVar45[0x19]];
    cVar3 = (((ThreadData_conflict *)puVar66)->mb).e_mbd.left_partition_context
            [*(uint *)((long)plVar45 + 0xc4) & 0x1f];
    *(undefined1 (*) [16])(plVar45 + 0x60) = (undefined1  [16])0x0;
    plVar45[0x62] = 0;
    *(undefined1 *)(plVar45 + 99) = 1;
    *(int *)((long)plVar45 + 0x2fc) = 0;
    lVar42 = plVar45[7];
    iVar48 = *(int *)(plVar45[0x77] +
                      ((ulong)((uint)(((uint)(int)cVar36 >> ((uint)lVar53 & 0x1f) & 1) != 0) +
                              ((uint)(int)cVar3 >> ((byte)lVar53 & 0x1f) & 1) * 2) +
                       (ulong)bVar62 * 4 + -4) * 0x28 + lVar42 * 4);
    *(int *)(plVar45 + 0x5f) = iVar48;
    plVar45[0x61] = (long)(((ThreadData_conflict *)puVar66)->mb).rdmult * (long)iVar48 + 0x100 >> 9;
    lVar53 = 0;
    do {
      pMVar13 = (MB_MODE_INFO *)plVar45[lVar53 + 0x44];
      pTVar14 = (ThreadData_conflict *)plVar45[1];
      if (pMVar13 != (MB_MODE_INFO *)0x0) {
        (pTVar14->mb).use_mb_mode_cache = 1;
        (pTVar14->mb).mb_mode_cache = pMVar13;
      }
      iVar48 = *(int *)(plVar45[0x10] + -4 + lVar53 * 8);
      uVar76 = *(undefined4 *)(plVar45[0x10] + lVar53 * 8);
      bVar62 = *(byte *)((long)paBVar41 + lVar53);
      lVar51 = plVar44[lVar53];
      plVar45[-4] = plVar45[0xb6];
      *(undefined1 (*) [16])(plVar45 + -6) = *(undefined1 (*) [16])(plVar45 + 0xb4);
      plVar45[-8] = plVar45[0xb2];
      plVar45[-7] = plVar45[0xb3];
      plVar45[-1] = lVar51;
      *(uint *)(plVar45 + -2) = (uint)lVar42 & 0xff;
      plVar45[-3] = (long)(plVar45 + 0x5f);
      *(uint *)(plVar45 + -9) = (uint)bVar62;
      *(undefined4 *)(plVar45 + -10) = uVar76;
      plVar45[-0xb] = 0x1ef47a;
      iVar48 = rd_try_subblock((AV1_COMP *)plVar45[2],pTVar14,(TileDataEnc *)plVar45[10],
                               (TokenExtra **)plVar45[0x15],(uint)(lVar53 == 2),iVar48,
                               (int)plVar45[-10],*(BLOCK_SIZE *)(plVar45 + -9),
                               *(RD_STATS *)(plVar45 + -8),(RD_STATS *)plVar45[-3],
                               (PARTITION_TYPE)plVar45[-2],(PICK_MODE_CONTEXT *)plVar45[-1]);
      (pTVar14->mb).use_mb_mode_cache = 0;
      (pTVar14->mb).mb_mode_cache = (MB_MODE_INFO *)0x0;
      if (iVar48 == 0) goto LAB_001ef4b7;
      lVar53 = lVar53 + 1;
    } while (lVar53 != 3);
    uVar38 = *(uint *)(plVar45 + 0x5f);
    if ((ulong)uVar38 == 0x7fffffff) {
LAB_001ef4b7:
      bVar62 = 0;
      puVar66 = (uint *)plVar45[1];
      pAVar65 = (AV1_COMP *)plVar45[2];
    }
    else {
      lVar53 = plVar45[0x60];
      bVar62 = 0;
      puVar66 = (uint *)plVar45[1];
      pAVar65 = (AV1_COMP *)plVar45[2];
      if ((lVar53 != 0x7fffffffffffffff) && (plVar45[0x61] != 0x7fffffffffffffff)) {
        lVar42 = (long)(((ThreadData_conflict *)puVar66)->mb).rdmult;
        if ((int)uVar38 < 0) {
          lVar51 = lVar53 * 0x80 - ((long)((ulong)-uVar38 * lVar42 + 0x100) >> 9);
        }
        else {
          lVar51 = lVar53 * 0x80 + ((long)((ulong)uVar38 * lVar42 + 0x100) >> 9);
        }
        if ((lVar51 < plVar45[0xb4]) &&
           (lVar53 = ((int)uVar38 * lVar42 + 0x100 >> 9) + lVar53 * 0x80, plVar45[0x61] = lVar53,
           lVar53 < plVar45[0xb4])) {
          plVar45[0xb6] = plVar45[99];
          plVar45[0xb4] = plVar45[0x61];
          plVar45[0xb5] = plVar45[0x62];
          plVar45[0xb2] = plVar45[0x5f];
          plVar45[0xb3] = plVar45[0x60];
          *(char *)plVar45[0xb7] = (char)plVar45[7];
          bVar62 = 1;
        }
        else {
          bVar62 = 0;
        }
      }
    }
    *(byte *)((long)plVar45 + 0x1fc) = *(byte *)((long)plVar45 + 0x1fc) | bVar62;
    bVar69 = ((pAVar65->common).seq_params)->monochrome == '\0';
    uVar38 = bVar69 + 1 + (uint)bVar69;
    rect_part_win_info_00 = (RD_RECT_PART_WIN_INFO *)(ulong)uVar38;
    uVar52 = (ulong)*(BLOCK_SIZE *)(plVar45 + 9);
    plVar45[-1] = 0x1ef500;
    av1_restore_context((MACROBLOCK *)puVar66,(RD_SEARCH_MACROBLOCK_CONTEXT *)(plVar45 + 0x7f),
                        (int)plVar45[6],(int)plVar45[5],*(BLOCK_SIZE *)(plVar45 + 9),uVar38);
LAB_001ef500:
    part_none_rd = part_none_rd + 1;
    paBVar41 = (BLOCK_SIZE (*) [6])((long)paBVar41 + 3);
    plVar45[0x10] = plVar45[0x10] + 0x18;
    if (part_none_rd == &DAT_00000004) {
      BVar47 = *(BLOCK_SIZE *)(plVar45 + 0x1d);
      uVar52 = plVar45[0xb4];
      uVar40 = (ulong)*(uint *)(plVar45 + 0xf);
      goto LAB_001ef63b;
    }
    goto LAB_001ef033;
  case 3:
    lVar53 = *(long *)plVar45[0x48];
    lVar42 = plVar45[0xb7];
    if ((lVar53 == 0) || (*(int *)(lVar53 + 0x1a8) == 0x7fffffff)) {
      lVar53 = 0;
    }
    plVar45[0x44] = lVar53;
    lVar53 = *(long *)(lVar42 + 0xd8);
LAB_001ef2aa:
    if (((lVar53 == 0) || (lVar53 = *(long *)(lVar53 + 8), lVar53 == 0)) ||
       (*(int *)(lVar53 + 0x1a8) == 0x7fffffff)) {
      lVar53 = 0;
    }
    plVar45[0x45] = lVar53;
    if (*(long *)(lVar42 + 0xe8) != 0) {
      lVar53 = *(long *)(*(long *)(lVar42 + 0xe8) + 8);
      goto LAB_001ef2de;
    }
    goto LAB_001ef2ef;
  case 4:
    goto switchD_001ef166_caseD_4;
  default:
    goto switchD_001ef166_caseD_5;
  case 7:
    goto switchD_001ef166_caseD_7;
  case 10:
    plVar45 = (long *)0x1;
    pAVar23 = pAVar65;
    goto LAB_001ef797;
  case 0xd:
    *(undefined1 *)((long)plVar44 + 0x36) = 0;
    pAVar23 = tile_data_01;
    goto LAB_001ef797;
  case 0xe:
    goto switchD_001ef166_caseD_e;
  case 0xf:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
    tp_00 = (uint *)((long)&UINT_004e4d6c + 3);
    if (!bVar69) {
      tile_data_01 = (AV1_COMP *)((ulong)tile_data_01 & 0xff);
      goto LAB_001ed4eb;
    }
    iVar48 = iRam0000000000000000 + iVar48;
    iRam0000000000000000._0_1_ = (char)iVar48;
    iRam0000000000000000 = CONCAT31((int3)((uint)iVar48 >> 8),(char)iRam0000000000000000 + _Var25);
switchD_001ed552_caseD_1ed555:
    td_00 = (uint8_t *)0x1;
    goto switchD_001ed552_caseD_1ed580;
  case 0x11:
    pcVar33 = (char *)((long)pAVar50[7].frame_new_probs[8].tx_type_probs[2][0x10] + 0x26);
    *pcVar33 = *pcVar33 + _Var25;
    return _Var25;
  case 0x14:
    goto switchD_001ef166_caseD_14;
  case 0x17:
    goto switchD_001ef166_caseD_17;
  case 0x18:
    goto switchD_001ef166_caseD_18;
  case 0x19:
  case 0x1a:
  case 0x1c:
  case 0x1d:
  case 0x1f:
  case 0x20:
    goto switchD_001ef166_caseD_19;
  case 0x1b:
    halt_baddata();
  case 0x1e:
    goto switchD_001ef166_caseD_1e;
  case 0x21:
    goto switchD_001ef166_caseD_21;
  case 0x22:
    goto switchD_001ef166_caseD_22;
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x27:
  case 0x29:
  case 0x2a:
    halt_baddata();
  case 0x25:
    goto switchD_001ef166_caseD_25;
  case 0x28:
    *puVar31 = *puVar31 + _Var25;
    goto LAB_001efc99;
  case 0x2b:
    goto switchD_001ef166_caseD_2b;
  case 0x2c:
    goto switchD_001ef166_caseD_2c;
  case 0x2d:
  case 0x2e:
  case 0x30:
  case 0x31:
  case 0x33:
  case 0x34:
    *(undefined2 *)(puVar31 + (long)plVar44 * 4) = in_FS;
    *puVar31 = *puVar31 + _Var25;
    cRam00000000018782c4 = cRam00000000018782c4 + 'p';
    pcVar33 = (char *)((ulong)puVar31 & 0xffffffffffffffa0);
    *pcVar33 = *pcVar33 + (char)pcVar33;
    cRam00000000018782cc = cRam00000000018782cc + 'p';
    puVar31 = (uint8_t *)((ulong)puVar31 & 0xffffffffffffff80);
    *puVar31 = *puVar31 + (char)puVar31;
    *(char *)((long)plVar44 + -0x4d) = *(char *)((long)plVar44 + -0x4d) + cVar36;
    iRam0000000001878300 = iRam0000000001878300 + 1;
    goto code_r0x001f0005;
  case 0x2f:
    *puVar31 = *puVar31 + _Var25;
    pcVar33 = (char *)((long)&switchD_001eeeba::switchdataD_004e4cf8 + lVar53 + 1);
    *pcVar33 = *pcVar33 + 'p';
    pcVar33 = (char *)CONCAT62((int6)((ulong)puVar31 >> 0x10),CONCAT11(0x24,_Var25));
    *pcVar33 = _Var25;
    *pcVar33 = *pcVar33 + _Var25;
    tp_00 = (uint *)(ulong)*(byte *)(plVar45 + 0x2b);
    uVar40 = plVar45[0x2a];
    paBVar41 = (BLOCK_SIZE (*) [6])plVar45[0x29];
    uVar52 = plVar45[0x28];
    plVar44 = (long *)plVar45[0x27];
    plVar45[0x12] = plVar45[0x26];
    *(int *)((long)plVar45 + 0x6c) = *(int *)(uVar52 + 0xc);
    *(int *)(plVar45 + 0xd) = *(int *)(uVar52 + 0x10);
    puVar61 = (uint *)(ulong)*(byte *)(uVar52 + 0x30);
    plVar45[0x10] = (long)pAVar50;
    plVar45[0x19] = *(long *)&(pAVar50->common).mi_params.mi_rows;
    pAVar50 = (AV1_COMP *)(ulong)*(byte *)(plVar45 + 0x2b);
    goto code_r0x001effdf;
  case 0x32:
    *puVar31 = *puVar31 + _Var25;
  case 0x35:
    plVar45[-1] = (long)puVar31;
    pbVar1 = (byte *)((long)&switchD_001eeeba::switchdataD_004e4cf8 + lVar53 + 1);
    *pbVar1 = *pbVar1 ^ 0x70;
    plVar45 = (long *)0x8024;
    pcVar33 = (char *)((long)&switchD_001eeeba::switchdataD_004e4cf8 + lVar53 + 3);
    *pcVar33 = *pcVar33 + 'p';
    LOCK();
    *(int *)((long)puVar31 * 8 + -0x7669b28d) = (int)tile_data_01;
    UNLOCK();
switchD_001ef166_caseD_2c:
    *puVar31 = *puVar31 + _Var25;
    ((MB_MODE_INFO *)&pAVar50->ppi)->bsize =
         (char)*(aom_codec_err_t *)&((MB_MODE_INFO *)&pAVar50->ppi)->bsize + 0x70;
code_r0x001effdf:
    *(char *)((long)plVar45 + 0x5f) = (char)tp_00;
    *(RD_RECT_PART_WIN_INFO **)((long)plVar45 + 0xa8) = rect_part_win_info_00;
    *(uint **)((long)plVar45 + 0xa0) = puVar61;
    *(ulong *)((long)plVar45 + 0x98) = uVar40;
    if ((char)tp_00 == -1) {
switchD_001ef166_caseD_3f:
      puVar31 = (uint8_t *)(uVar52 + 0x80);
      break;
    }
    pc_tree_00 = (BLOCK_SIZE (*) [2] [2])0xff;
    puVar31 = (uint8_t *)((ulong)puVar61 & 0xffffffff);
code_r0x001f0005:
    BVar24 = (BLOCK_SIZE)pc_tree_00;
    uVar38 = (uint)puVar61;
    if (uVar38 < 10) {
switchD_001ef166_caseD_39:
      uVar26 = (*(code *)((long)&switchD_001f001c::switchdataD_004e4e20 +
                         (long)(int)(&switchD_001f001c::switchdataD_004e4e20)[(long)puVar31]))();
      return (_Bool)uVar26;
    }
    if (uVar38 == 0xc) {
      lVar53 = 4;
switchD_001f001c_caseD_0:
      BVar24 = subsize_lookup[(long)pAVar50][lVar53];
    }
    else if (uVar38 == 0xf) {
      lVar53 = 5;
      goto switchD_001f001c_caseD_0;
    }
    *(ulong *)((long)plVar45 + 0x70) = uVar52 + 0x80;
    *(undefined8 *)(uVar52 + 0x80) = 0;
    *(undefined8 *)(uVar52 + 0x88) = 0;
    *(undefined8 *)(uVar52 + 0x90) = 0;
    *(undefined8 *)(uVar52 + 0x98) = 0;
    *(undefined1 *)(uVar52 + 0xa0) = 1;
    BVar47 = BLOCK_INVALID;
    *(BLOCK_SIZE *)((long)plVar45 + 0x5e) = BVar24;
    if (uVar38 < 10) {
      uVar26 = (*(code *)((long)&switchD_001f00e1::switchdataD_004e4e48 +
                         (long)(int)(&switchD_001f00e1::switchdataD_004e4e48)[(long)puVar31]))();
      return (_Bool)uVar26;
    }
    if (uVar38 == 0xc) {
      lVar53 = 4;
switchD_001f00e1_caseD_0:
      BVar47 = subsize_lookup[(long)pAVar50][lVar53];
    }
    else if (uVar38 == 0xf) {
      lVar53 = 5;
      goto switchD_001f00e1_caseD_0;
    }
    goto switchD_001f00e1_caseD_1;
  case 0x36:
    *puVar31 = *puVar31 + _Var25;
    break;
  case 0x37:
  case 0x38:
  case 0x3a:
  case 0x3b:
  case 0x3d:
  case 0x3e:
    *puVar31 = *puVar31 + _Var25;
    break;
  case 0x39:
    goto switchD_001ef166_caseD_39;
  case 0x3c:
    break;
  case 0x3f:
    goto switchD_001ef166_caseD_3f;
  case 0x40:
    *puVar31 = *puVar31 & _Var25;
    pcVar33 = (char *)((long)((PC_TREE *)((long)pc_tree_00 + -0x7cfe50d8))->split + 0x12);
    *pcVar33 = *pcVar33 + 'p';
    plVar45[-1] = *(undefined8 *)
                   ((undefined1 *)((long)&pAVar50[-1].ducky_encode_info.frame_result.dist + 3) +
                   (long)tile_data_01);
    plVar45[-2] = (long)tile_data_01;
    pcVar33 = (char *)CONCAT71(uVar35,_Var25 + -0x7d);
    plVar45[-3] = *(undefined8 *)((long)pAVar50[7].frame_new_probs[8].tx_type_probs[2][0x10] + 0x2e)
    ;
    *pcVar33 = *pcVar33 + _Var25 + -0x7d;
    switchD_001ef166::switchdataD_004e4d70._0_1_ = cVar36 + -8;
  case 0x49:
    pcVar11 = (code *)swi(1);
    uVar26 = (*pcVar11)();
    return (_Bool)uVar26;
  case 0x41:
  case 0x42:
  case 0x44:
  case 0x45:
  case 0x47:
  case 0x48:
    piVar54 = (int *)((long)&UINT_004e4d7c + lVar53 + 3);
    *piVar54 = *piVar54 + iVar48;
    halt_baddata();
  case 0x43:
    goto switchD_001ef166_caseD_43;
  case 0x46:
    pcVar33 = (char *)(ulong)(uint)(int)(char)*puVar31;
    *pcVar33 = *pcVar33 + *puVar31;
switchD_001ef166_caseD_43:
    puVar31 = (byte *)0x0;
    tp_00 = (uint *)(ulong)(byte)puVar61[6];
    piVar54 = (int *)((long)((PC_TREE *)((long)pc_tree_00 + 0x25b88))->horizontal +
                     (ulong)((byte)puVar61[6] == 1) * 4 + plVar45[3] * 8 + -0x10);
    *piVar54 = *piVar54 + 1;
code_r0x001f1574:
    if ((char)puVar31 != '\0') {
      piVar54 = (int *)((long)((PC_TREE *)((long)pc_tree_00 + 0x25b88))->vertical4 +
                       (ulong)((char)tp_00 == '\x02') * 4);
      *piVar54 = *piVar54 + 1;
    }
LAB_001f0fbf:
    pPVar28 = ((PC_TREE *)((long)pc_tree_00 + 0x40e8))->horizontal4[0];
    lVar53 = *(long *)&((PC_TREE *)((long)pc_tree_00 + 0x1ff8))->verticala[0]->mic;
    bVar62 = *(byte *)(lVar53 + 0x10);
    bVar60 = *(byte *)(lVar53 + 0x11);
    if ((char)bVar60 < '\x01') goto LAB_001f101f;
    if (4 < bVar60 && (char)bVar62 < '\x05') goto LAB_001f1015;
    lVar53 = 0;
    goto LAB_001f0ffd;
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x52:
  case 0x53:
    goto code_r0x001f1574;
  case 0x4d:
    pcVar11 = (code *)swi(1);
    uVar26 = (*pcVar11)();
    return (_Bool)uVar26;
  case 0x4e:
    *(int *)plVar45 = iVar48;
code_r0x001f171f:
    uVar40 = (ulong)*(byte *)&(((ThreadData_conflict *)td_00)->mb).plane[0].quant_shift_QTX;
    plVar45[1] = uVar40;
    __n = 0xff;
    plVar45[-1] = 0x1f174a;
    memset(pAVar50,0x16,uVar40);
    pvVar34 = (void *)*plVar45;
    plVar45[-1] = 0x1f1766;
    memset(pvVar34,0xe5,0xff);
    pPVar28 = ((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4[1];
    bVar62 = partition_context_lookup[(long)paBVar41].above;
    plVar45[-1] = 0x1f1789;
    memset((void *)((long)(pPVar28->mic).mv + (long)((int)pAVar65 + iVar27) + -8),(uint)bVar62,
           plVar45[1]);
    uVar38 = (uint)(byte)partition_context_lookup[(long)paBVar41].left;
    goto LAB_001f16db;
  case 0x4f:
    *puVar31 = *puVar31 + _Var25;
    td_00 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10";
    bVar62 = *(byte *)(lVar53 + 0x9c9c30);
    bVar60 = bVar62 >> 1;
    pAVar65 = (AV1_COMP *)(ulong)bVar60;
    switch((ulong)rect_part_win_info_00 & 0xff) {
    case 3:
      if ((char)uVar52 != '\x03') {
        return _Var25;
      }
    default:
      pPVar28 = ((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4[1];
      pvVar34 = (void *)((long)((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4 +
                        (ulong)(uVar38 & 0x1f) + 0x10);
      __n = (size_t)*(byte *)(lVar53 + 0x9c9c50);
      plVar45[-1] = 0x1f16cf;
      memset((void *)((long)(pPVar28->mic).mv + (long)iVar27 + -8),0x16,(ulong)bVar62);
      uVar38 = 0xe5;
      break;
    case 4:
      pPVar28 = ((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4[1];
      *plVar45 = (long)((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4 +
                 (ulong)(uVar38 & 0x1f) + 0x10;
      plVar45[1] = 10;
      plVar45[2] = 0xff;
      bVar62 = partition_context_lookup[(long)paBVar41].above;
      plVar45[-1] = 0x1f1893;
      memset((void *)((long)(pPVar28->mic).mv + (long)iVar27 + -8),(uint)bVar62,10);
      bVar62 = partition_context_lookup[(long)paBVar41].left;
      __n = plVar45[2];
      plVar45[-1] = 0x1f18b1;
      memset((void *)*plVar45,(uint)bVar62,__n);
      pPVar28 = ((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4[1];
      pvVar34 = (void *)((long)((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4 +
                        (ulong)(bVar60 + uVar38 & 0x1f) + 0x10);
      plVar45[-1] = 0x1f18e2;
      memset((void *)((long)(pPVar28->mic).mv + (long)iVar27 + -8),0x16,plVar45[1]);
      uVar38 = 0xe5;
      break;
    case 5:
      part_none_rd = (BLOCK_SIZE *)(long)iVar27;
      pAVar50 = (AV1_COMP *)
                (part_none_rd +
                (long)((((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4[1]->mic).mv + -2));
      *plVar45 = (long)((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4 +
                 (ulong)(uVar38 & 0x1f) + 0x10;
      plVar44 = (long *)0x70;
      tile_data_01 = (AV1_COMP *)0xa;
      plVar45[1] = 10;
      puVar31 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04";
      goto switchD_001ef166_caseD_50;
    case 6:
      pPVar28 = ((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4[1];
      *plVar45 = (long)((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4 +
                 (ulong)(uVar38 & 0x1f) + 0x10;
      plVar45[1] = 10;
      __n = 0xff;
      bVar62 = partition_context_lookup[(long)paBVar41].above;
      plVar45[-1] = 0x1f193a;
      memset((void *)((long)(pPVar28->mic).mv + (long)iVar27 + -8),(uint)bVar62,10);
      bVar62 = partition_context_lookup[(long)paBVar41].left;
      pvVar34 = (void *)*plVar45;
      plVar45[-1] = 0x1f1956;
      memset(pvVar34,(uint)bVar62,0xff);
      pPVar28 = ((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4[1];
      plVar45[-1] = 0x1f1979;
      memset((void *)((long)(pPVar28->mic).mv + (long)(int)((uint)bVar60 + iVar27) + -8),0x16,
             plVar45[1]);
      uVar38 = 0xe5;
      break;
    case 7:
      pAVar50 = (AV1_COMP *)
                ((long)(((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4[1]->mic).mv +
                (long)iVar27 + -8);
      *plVar45 = (long)((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4 +
                 (ulong)(uVar38 & 0x1f) + 0x10;
      goto code_r0x001f171f;
    }
LAB_001f16db:
    pvVar34 = memset(pvVar34,uVar38,__n);
    return SUB81(pvVar34,0);
  case 0x50:
switchD_001ef166_caseD_50:
    plVar45[2] = (ulong)*(byte *)((long)plVar44 + (long)puVar31);
    bVar62 = partition_context_lookup[(long)plVar44].above;
    plVar45[-1] = 0x1f17e5;
    memset(pAVar50,(uint)bVar62,(size_t)tile_data_01);
    bVar62 = partition_context_lookup[(long)plVar44].left;
    __n = plVar45[2];
    plVar45[-1] = 0x1f1802;
    memset((void *)*plVar45,(uint)bVar62,__n);
    pPVar28 = ((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4[1];
    pvVar34 = (void *)((long)((PC_TREE *)((long)pc_tree_00 + 0x1f00))->horizontal4 +
                      (ulong)((int)pAVar65 + uVar38 & 0x1f) + 0x10);
    bVar62 = partition_context_lookup[(long)paBVar41].above;
    plVar45[-1] = 0x1f1833;
    memset(part_none_rd + (long)pPVar28,(uint)bVar62,plVar45[1]);
    uVar38 = (uint)(byte)partition_context_lookup[(long)paBVar41].left;
    goto LAB_001f16db;
  case 0x51:
    if (((((char)td_00 != '\0') || ((byte)tile_data_01 < 8)) && (7 < (byte)tile_data_01)) &&
       ((0xf3 < (byte)(*(char *)((long)puVar61 + 2) - 0x19U) &&
        (*(char *)((long)puVar61 + 0x11) < '\0')))) goto switchD_001ef166_caseD_43;
    goto LAB_001f0fbf;
  }
  *(uint8_t **)((long)plVar45 + 0x70) = puVar31;
  *(undefined8 *)(uVar52 + 0x80) = 0;
  *(undefined8 *)(uVar52 + 0x88) = 0;
  *(undefined8 *)(uVar52 + 0x90) = 0;
  *(undefined8 *)(uVar52 + 0x98) = 0;
  *(undefined1 *)(uVar52 + 0xa0) = 1;
  *(undefined1 *)((long)plVar45 + 0x5e) = 0xff;
  BVar47 = BLOCK_INVALID;
switchD_001f00e1_caseD_1:
  lVar53 = *(long *)(uVar52 + 0xb8);
  *(AV1_COMP **)((long)plVar45 + 0xb0) = pAVar50;
  iVar48 = *(int *)(lVar53 + (long)pAVar50 * 4);
  *(int *)(uVar52 + 0x80) = iVar48;
  iVar27 = *(int *)(*(long *)((long)plVar45 + 0x78) + 0x4218);
  *(ulong *)((long)plVar45 + 0x60) = uVar52;
  *(long *)(uVar52 + 0x90) = (long)iVar27 * (long)iVar48 + 0x100 >> 9;
  lVar53 = *(long *)((long)plVar45 + 0x88);
  lVar42 = 0;
  do {
    *(int *)((long)plVar45 + -8) = 0x1f0193;
    *(int *)((long)plVar45 + -4) = 0;
    pPVar28 = av1_alloc_pmc(*(AV1_COMP **)((long)plVar45 + 0x80),BVar47,
                            (PC_TREE_SHARED_BUFFERS *)(lVar53 + 0x25c60));
    plVar44[lVar42] = (long)pPVar28;
    if (pPVar28 == (PICK_MODE_CONTEXT *)0x0) {
      paVar8 = *(aom_internal_error_info **)(*(long *)((long)plVar45 + 0x78) + 0x2b90);
      *(int *)((long)plVar45 + -8) = 0x1f01b8;
      *(int *)((long)plVar45 + -4) = 0;
      aom_internal_error(paVar8,AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
    }
    lVar42 = lVar42 + 1;
  } while (lVar42 != 4);
  iVar48 = **(int **)((long)plVar45 + 0x98);
  iVar27 = (*(int **)((long)plVar45 + 0x98))[1];
  lVar53 = 0;
  iVar78 = *(int *)((long)plVar45 + 0x6c);
  iVar49 = *(int *)((long)plVar45 + 0x68);
  do {
    *(int *)((long)plVar45 + (lVar53 * 2 + 0x34) * 4) = iVar78;
    *(int *)((long)plVar45 + (lVar53 * 2 + 0x35) * 4) = iVar49;
    lVar53 = lVar53 + 1;
    iVar49 = iVar49 + iVar27;
    iVar78 = iVar78 + iVar48;
  } while (lVar53 != 4);
  cVar36 = *(char *)((long)plVar45 + 0x5f);
  lVar53 = 0;
  bVar62 = *(byte *)((long)plVar45 + 0x5e);
  while ((lVar53 == 0 ||
         (*(int *)((long)plVar45 + lVar53 + (ulong)(cVar36 != '\b') * 4 + 0xd0) <
          *(int *)((long)plVar45 + ((ulong)(cVar36 != '\b') + 0x32) * 4)))) {
    lVar42 = *(long *)((long)plVar44 + lVar53);
    *(undefined4 *)(lVar42 + 0x1d0) = 0;
    iVar48 = *(int *)((long)plVar45 + lVar53 + 0xd0);
    uVar76 = *(undefined4 *)((long)plVar45 + lVar53 + 0xd4);
    *(undefined8 *)((long)plVar45 + 0x30) = *(undefined8 *)(paBVar41[5] + 2);
    uVar16 = *(undefined8 *)paBVar41;
    uVar17 = *(undefined8 *)(paBVar41[1] + 2);
    uVar18 = *(undefined8 *)(paBVar41 + 4);
    *(undefined8 *)((long)plVar45 + 0x20) = *(undefined8 *)(paBVar41[2] + 4);
    *(undefined8 *)((long)plVar45 + 0x28) = uVar18;
    *(undefined8 *)((long)plVar45 + 0x10) = uVar16;
    *(undefined8 *)((long)plVar45 + 0x18) = uVar17;
    *(long *)((long)plVar45 + 0x48) = lVar42;
    *(int *)((long)plVar45 + 0x40) = (int)*(undefined8 *)((long)plVar45 + 0xb0);
    *(undefined8 *)((long)plVar45 + 0x38) = *(undefined8 *)((long)plVar45 + 0x70);
    *(uint *)((long)plVar45 + 8) = (uint)bVar62;
    *(undefined4 *)plVar45 = uVar76;
    *(int *)((long)plVar45 + -8) = 0x1f02b7;
    *(int *)((long)plVar45 + -4) = 0;
    iVar48 = rd_try_subblock(*(AV1_COMP **)((long)plVar45 + 0x80),
                             *(ThreadData_conflict **)((long)plVar45 + 0x88),
                             *(TileDataEnc **)((long)plVar45 + 0xb8),
                             *(TokenExtra ***)((long)plVar45 + 0xc0),(uint)(lVar53 == 0x18),iVar48,
                             *(int *)plVar45,*(BLOCK_SIZE *)((long)plVar45 + 8),
                             *(RD_STATS *)((long)plVar45 + 0x10),
                             *(RD_STATS **)((long)plVar45 + 0x38),
                             (PARTITION_TYPE)*(int *)((long)plVar45 + 0x40),
                             *(PICK_MODE_CONTEXT **)((long)plVar45 + 0x48));
    if (iVar48 == 0) goto LAB_001f0310;
    lVar53 = lVar53 + 8;
    if (lVar53 == 0x20) break;
  }
  uVar38 = **(uint **)((long)plVar45 + 0x70);
  if ((((ulong)uVar38 != 0x7fffffff) &&
      (lVar53 = *(long *)(*(long *)((long)plVar45 + 0x60) + 0x88), lVar53 != 0x7fffffffffffffff)) &&
     (*(long *)(*(long *)((long)plVar45 + 0x60) + 0x90) != 0x7fffffffffffffff)) {
    if ((int)uVar38 < 0) {
      lVar53 = lVar53 * 0x80 -
               ((long)((ulong)-uVar38 * (long)*(int *)(*(long *)((long)plVar45 + 0x78) + 0x4218) +
                      0x100) >> 9);
    }
    else {
      lVar53 = lVar53 * 0x80 +
               ((long)((ulong)uVar38 * (long)*(int *)(*(long *)((long)plVar45 + 0x78) + 0x4218) +
                      0x100) >> 9);
    }
    lVar42 = *(long *)((long)plVar45 + 0x60);
    *(long *)(lVar42 + 0x90) = lVar53;
    if (lVar53 < *(long *)(paBVar41[2] + 4)) {
      puVar46 = *(undefined8 **)((long)plVar45 + 0x70);
      *(undefined8 *)(paBVar41[5] + 2) = puVar46[4];
      uVar16 = *puVar46;
      uVar17 = puVar46[1];
      uVar18 = puVar46[3];
      *(undefined8 *)(paBVar41[2] + 4) = puVar46[2];
      *(undefined8 *)(paBVar41 + 4) = uVar18;
      *(undefined8 *)paBVar41 = uVar16;
      *(undefined8 *)(paBVar41[1] + 2) = uVar17;
      *(undefined1 *)(lVar42 + 0x144) = 1;
      **(undefined1 **)((long)plVar45 + 0x90) = *(undefined1 *)((long)plVar45 + 0x5f);
    }
    goto LAB_001f0346;
  }
LAB_001f0310:
  lVar53 = *(long *)((long)plVar45 + 0x60);
  *(undefined8 *)(lVar53 + 0x80) = 0x7fffffff;
  *(undefined8 *)(lVar53 + 0x88) = 0x7fffffffffffffff;
  *(undefined8 *)(lVar53 + 0x90) = 0x7fffffffffffffff;
  *(undefined8 *)(lVar53 + 0x98) = 0x7fffffffffffffff;
  *(undefined1 *)(lVar53 + 0xa0) = 0;
LAB_001f0346:
  bVar69 = *(char *)(*(long *)(*(long *)((long)plVar45 + 0x80) + 0x42008) + 0x4d) == '\0';
  av1_restore_context(*(MACROBLOCK **)((long)plVar45 + 0x78),
                      *(RD_SEARCH_MACROBLOCK_CONTEXT **)((long)plVar45 + 0xa8),
                      *(int *)((long)plVar45 + 0x6c),*(int *)((long)plVar45 + 0x68),
                      (BLOCK_SIZE)*(undefined8 *)((long)plVar45 + 0xa0),bVar69 + 1 + (uint)bVar69);
  return (_Bool)extraout_AL;
LAB_001f0ffd:
  if ((bVar62 == (&comp_ref0_lut)[lVar53]) && (bVar60 == (&comp_ref1_lut)[lVar53])) {
    bVar62 = (char)lVar53 + 0x14;
    goto LAB_001f101f;
  }
  lVar53 = lVar53 + 1;
  if (lVar53 == 9) {
LAB_001f1015:
    bVar62 = (bVar60 * '\x04' + bVar62) - 0xd;
LAB_001f101f:
    uVar40 = (ulong)bVar62;
    pPVar19 = ((PC_TREE *)((long)pc_tree_00 + 0x3c10))->verticala[(ulong)bVar62 * 4];
    pPVar20 = (((PC_TREE *)((long)pc_tree_00 + 0x3c10))->verticala + (ulong)bVar62 * 4)[1];
    pPVar21 = (((PC_TREE *)((long)pc_tree_00 + 0x3c10))->verticalb + (ulong)bVar62 * 4 + -1)[1];
    *(PICK_MODE_CONTEXT **)(pPVar28->mic).ref_frame =
         ((PC_TREE *)((long)pc_tree_00 + 0x3c10))->verticalb[(ulong)bVar62 * 4 + -1];
    *(PICK_MODE_CONTEXT **)&(pPVar28->mic).motion_mode = pPVar21;
    *(PICK_MODE_CONTEXT **)&pPVar28->mic = pPVar19;
    *(PICK_MODE_CONTEXT **)(pPVar28->mic).mv = pPVar20;
    *(PICK_MODE_CONTEXT **)((pPVar28->mic).wm_params.wmmat + 1) =
         ((PC_TREE *)((long)pc_tree_00 + 0x3ff0))->vertical[uVar40];
    *(undefined2 *)((long)&(pPVar28->mic).interinter_comp.seg_mask + 4) =
         *(undefined2 *)
          ((long)((PC_TREE *)((long)pc_tree_00 + 0x40e8))->horizontalb + uVar40 * 2 + 8);
    *(undefined1 *)((pPVar28->mic).wm_params.wmmat + 3) =
         *(undefined1 *)((long)((PC_TREE *)((long)pc_tree_00 + 0x40e8))->horizontal + uVar40);
    pPVar19 = ((PC_TREE *)((long)pc_tree_00 + 0x40e8))->horizontala[1];
    pPVar20 = ((PC_TREE *)((long)pc_tree_00 + 0x40e8))->horizontala[2];
    pPVar21 = ((PC_TREE *)((long)pc_tree_00 + 0x40e8))->horizontalb[0];
    *(PICK_MODE_CONTEXT **)((pPVar28->mic).wm_params.wmmat + 4) =
         ((PC_TREE *)((long)pc_tree_00 + 0x40e8))->horizontala[0];
    *(PICK_MODE_CONTEXT **)&(pPVar28->mic).wm_params.alpha = pPVar19;
    *(PICK_MODE_CONTEXT **)&(pPVar28->mic).wm_params.wmtype = pPVar20;
    *(PICK_MODE_CONTEXT **)&(pPVar28->mic).field_0x44 = pPVar21;
    iVar48 = *(int *)((long)plVar45 + 0x24);
    *(int *)(((PC_TREE *)((long)pc_tree_00 + 0x41e0))->horizontala + 1) = iVar48;
    return SUB41(iVar48,0);
  }
  goto LAB_001f0ffd;
switchD_001ef166_caseD_2b:
LAB_001efc99:
  tp_00 = (uint *)(plVar45 + 0xb2);
  if (plVar45[0xb3] <
      (pAVar65->sf).part_sf.partition_search_breakout_dist_thr >>
      (10U - ((char)(((ThreadData_conflict *)((long)puVar66 + 0x4dcc00))->mb).mode_costs.
                    wedge_idx_cost[0xf][2] +
             (char)(((ThreadData_conflict *)((long)puVar66 + 0x4dcc00))->mb).mode_costs.
                   compound_type_cost[0x13][0]) & 0x3f)) {
switchD_001ef166_caseD_22:
    if ((int)*tp_00 <
        (int)((uint)(byte)(((ThreadData_conflict *)((long)puVar66 + 0x4dcc00))->mb).mode_costs.
                          wedge_idx_cost[0xf][10] *
             (pAVar65->sf).part_sf.partition_search_breakout_rate_thr)) {
      plVar45[0x3c] = 0;
    }
  }
  goto LAB_001edc44;
switchD_001ef166_caseD_21:
  goto switchD_001ed552_caseD_1ed58c;
switchD_001ef166_caseD_1e:
  puVar31 = (uint8_t *)((ulong)puVar31 ^ 0x77);
  goto switchD_001ed552_caseD_1ed58c;
switchD_001ef166_caseD_18:
  *(undefined4 *)((long)plVar44 + -0x6af0bf37) = 0x24bc89c6;
switchD_001ef166_caseD_19:
  *puVar31 = *puVar31 + _Var25;
  goto LAB_001ed5b6;
switchD_001ef166_caseD_e:
  if ((long)puVar31 < 0) goto switchD_001ed552_caseD_1ed580;
  pcVar33 = (char *)((long)(pAVar50->enc_quant_dequant_params).quants.y_quant[5] + 3);
  *pcVar33 = *pcVar33 + 'p';
  puVar31 = (uint8_t *)CONCAT71(uVar35,_Var25 + -0x7f);
  goto code_r0x001ed541;
LAB_001ef73d:
  do {
    uVar38 = 0;
    if (((char)puVar31 == '\0') && (*(int *)((long)plVar45 + lVar53 * 4 + 0x1d8) != 0)) {
      part_none_rd = (BLOCK_SIZE *)
                     (ulong)*(byte *)((long)rect_part_win_info_00->rect_part_win + lVar53);
      pAVar65 = (AV1_COMP *)0xff;
switchD_001ef166_caseD_4:
      if ((uint)uVar40 < 10) {
        switch((long)&(((ThreadData_conflict *)puVar66)->mb).plane[0].src_diff +
               (long)*(int *)((long)&(((ThreadData_conflict *)puVar66)->mb).plane[0].src_diff +
                             uVar40 * 4)) {
        case 0x1ef770:
          pAVar23 = (AV1_COMP *)0x1;
          break;
        case 0x1ef781:
switchD_001ef166_caseD_7:
          pAVar23 = (AV1_COMP *)0x3;
          break;
        case 0x1ef789:
          pAVar23 = (AV1_COMP *)&DAT_00000004;
          break;
        case 0x1ef791:
          pAVar23 = (AV1_COMP *)0x2;
          break;
        case 0x1ef7b2:
          goto switchD_001ef76d_caseD_1ef7b2;
        }
LAB_001ef797:
        pAVar65 = pAVar23;
        part_none_rd = (BLOCK_SIZE *)((long)part_none_rd * 3);
        paBVar41 = subsize_lookup;
switchD_001ef166_caseD_5:
        pAVar65 = (AV1_COMP *)
                  (ulong)(paBVar41[-3] + (long)part_none_rd * 2 + 2)
                         [(long)(pAVar65->enc_quant_dequant_params).quants.y_quant];
      }
      else {
        pAVar23 = tile_data_01;
        if ((int)tile_data_01 == 0) goto LAB_001ef797;
      }
switchD_001ef76d_caseD_1ef7b2:
      uVar38 = (uint)(*(BLOCK_SIZE *)
                       ((long)((PC_TREE *)pc_tree_00)->horizontal +
                       (long)((long)(((ThreadData_conflict *)td_00)->mb).plane +
                             (long)tp_00 * 2 + (long)pAVar65 * 4 + -0x10)) != BLOCK_INVALID);
      pAVar65 = *(AV1_COMP **)((long)plVar45 + 0x10);
    }
    *puVar61 = uVar38;
    lVar53 = 1;
    puVar61 = (uint *)((long)plVar45 + 100);
    uVar57 = (ulong)pAVar50 & 1;
    pAVar50 = (AV1_COMP *)0x0;
  } while (uVar57 != 0);
  puVar66 = *(uint **)((long)plVar45 + 8);
  if ((pAVar65->sf).part_sf.prune_ext_partition_types_search_level == 2) {
    cVar36 = **(char **)((long)plVar45 + 0x5b8);
    if ((4 < (byte)(cVar36 - 1U)) || (uVar38 = 1, (0x1dU >> ((byte)(cVar36 - 1U) & 0x1f) & 1) == 0))
    {
      uVar38 = (uint)(cVar36 == '\0');
    }
    *(uint *)((long)plVar45 + 0x60) = *(uint *)((long)plVar45 + 0x60) & uVar38;
    if ((5 < (byte)(cVar36 - 2U)) || (uVar38 = 1, (0x33U >> ((byte)(cVar36 - 2U) & 0x1f) & 1) == 0))
    {
      uVar38 = (uint)(cVar36 == '\0');
    }
    *(uint *)((long)plVar45 + 100) = *(uint *)((long)plVar45 + 100) & uVar38;
  }
  if ((((char)puVar31 == '\0' && (pAVar65->sf).part_sf.ml_prune_partition != 0) &&
      (*(int *)((long)plVar45 + 0x1d8) != 0)) && (*(int *)((long)plVar45 + 0x1dc) != 0)) {
    bVar62 = **(byte **)((long)plVar45 + 0x5b8);
    *(undefined8 *)((long)plVar45 + -0x10) = *(undefined8 *)((long)plVar45 + 0xb0);
    *(undefined8 *)((long)plVar45 + -0x18) = 0x1ef8b4;
    av1_ml_prune_4_partition
              (pAVar65,(MACROBLOCK *)puVar66,(uint)bVar62,uVar52,
               (PartitionSearchState *)((long)plVar45 + 0xb8),(int *)((long)plVar45 + 0x60),
               *(uint *)((long)plVar45 + -0x10));
  }
  iVar48 = (((ThreadData_conflict *)puVar66)->mb).qindex;
  *(undefined4 *)((long)plVar45 + 0x260) = 0;
  *(undefined4 *)((long)plVar45 + 800) = 0;
  iVar27 = 3;
  if (0x55 < iVar48) {
    iVar27 = (0xff - iVar48) / 0x55 + 1;
  }
  iVar48 = (pAVar65->sf).part_sf.prune_ext_part_using_split_info;
  lVar53 = 0;
  piVar54 = (int *)((long)plVar45 + 0x260);
  bVar69 = true;
  do {
    bVar67 = bVar69;
    if (((iVar48 != 0) &&
        (bVar62 = (&DAT_004e5318)[lVar53], *(int *)((long)plVar45 + (ulong)bVar62 * 4 + 0x60) != 0))
       && (iVar78 = (uint)(*(int *)((long)plVar45 + lVar53 * 4 + 0x104) != 0) +
                    (uint)(*(int *)((long)plVar45 + lVar53 * 4 + 0xf4) != 0) +
                    (uint)(*(int *)((long)plVar45 + lVar53 * 4 + 0xfc) != 0) +
                    (*piVar54 - (uint)(*(int *)((long)plVar45 + lVar53 * 4 + 0xec) == 0)) + 1,
          *piVar54 = iVar78, iVar78 < iVar27)) {
      *(undefined4 *)((long)plVar45 + (ulong)bVar62 * 4 + 0x60) = 0;
    }
    lVar53 = 1;
    piVar54 = (int *)((long)plVar45 + 800);
    bVar69 = false;
  } while (bVar67);
  bVar69 = *(int *)((long)plVar45 + 0x60) != 0;
LAB_001ef9c3:
  iVar48 = *(int *)((long)plVar45 + 0x1d0);
  puVar46 = plVar45;
  pAVar50 = pAVar65;
  td_00 = (uint8_t *)puVar66;
  if ((iVar48 == 0) && (bVar69)) {
    *(uint *)((long)plVar45 + 0x260) =
         (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                [*(long *)((long)plVar45 + 0x18)] >> 2);
    *(undefined4 *)((long)plVar45 + 0x264) = 0;
    *(undefined8 *)((long)plVar45 + -8) = 8;
    *(uint **)((long)plVar45 + -0x10) = (uint *)((long)plVar45 + 0x260);
    *(undefined1 **)((long)plVar45 + -0x18) = (undefined1 *)((long)plVar45 + 0x590);
    *(undefined1 **)((long)plVar45 + -0x20) = (undefined1 *)((long)plVar45 + 0xb8);
    *(undefined8 *)((long)plVar45 + -0x28) = *(undefined8 *)((long)plVar45 + 0x370);
    *(undefined8 *)((long)plVar45 + -0x30) = *(undefined8 *)((long)plVar45 + 0x5b8);
    *(undefined8 *)((long)plVar45 + -0x38) = 0x1efa3f;
    rd_pick_4partition(pAVar65,(ThreadData_conflict *)puVar66,
                       *(TileDataEnc **)((long)plVar45 + 0x50),
                       *(TokenExtra ***)((long)plVar45 + 0xa8),(MACROBLOCK *)puVar66,
                       (RD_SEARCH_MACROBLOCK_CONTEXT *)((long)plVar45 + 0x3f8),
                       *(PC_TREE **)((long)plVar45 + -0x30),
                       *(PICK_MODE_CONTEXT ***)((long)plVar45 + -0x28),
                       *(PartitionSearchState **)((long)plVar45 + -0x20),
                       *(RD_STATS **)((long)plVar45 + -0x18),*(int **)((long)plVar45 + -0x10),
                       *(PARTITION_TYPE *)((long)plVar45 + -8));
LAB_001efa43:
    iVar48 = *(int *)((long)plVar45 + 0x1d0);
    puVar46 = plVar45;
    pAVar50 = pAVar65;
  }
  if (((iVar48 == 0) && (*(int *)((long)puVar46 + 100) != 0)) &&
     (*(int *)((long)puVar46 + 0x44) < *(int *)((long)puVar46 + 0x5c))) {
    *(undefined4 *)((long)puVar46 + 0x260) = 0;
    *(uint *)((long)puVar46 + 0x264) =
         (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [*(long *)((long)puVar46 + 0x18)] >> 2);
    *(undefined8 *)((long)puVar46 + -8) = 9;
    *(undefined4 **)((long)puVar46 + -0x10) = (undefined4 *)((long)puVar46 + 0x260);
    *(undefined1 **)((long)puVar46 + -0x18) = (undefined1 *)((long)puVar46 + 0x590);
    *(undefined1 **)((long)puVar46 + -0x20) = (undefined1 *)((long)puVar46 + 0xb8);
    *(undefined8 *)((long)puVar46 + -0x28) = *(undefined8 *)((long)puVar46 + 0x3a8);
    *(undefined8 *)((long)puVar46 + -0x30) = *(undefined8 *)((long)puVar46 + 0x5b8);
    *(undefined8 *)((long)puVar46 + -0x38) = 0x1efac9;
    rd_pick_4partition(pAVar50,(ThreadData_conflict *)td_00,*(TileDataEnc **)((long)puVar46 + 0x50),
                       *(TokenExtra ***)((long)puVar46 + 0xa8),(MACROBLOCK *)td_00,
                       (RD_SEARCH_MACROBLOCK_CONTEXT *)((long)puVar46 + 0x3f8),
                       *(PC_TREE **)((long)puVar46 + -0x30),
                       *(PICK_MODE_CONTEXT ***)((long)puVar46 + -0x28),
                       *(PartitionSearchState **)((long)puVar46 + -0x20),
                       *(RD_STATS **)((long)puVar46 + -0x18),*(int **)((long)puVar46 + -0x10),
                       *(PARTITION_TYPE *)((long)puVar46 + -8));
  }
  puVar66 = (uint *)td_00;
  pAVar65 = pAVar50;
  if ((((pAVar50->common).seq_params)->sb_size != (BLOCK_SIZE)*(undefined8 *)((long)puVar46 + 0x18))
     || (*(char *)((long)puVar46 + 0x1fc) != '\0')) goto LAB_001efaf9;
  (((ThreadData_conflict *)td_00)->mb).must_find_valid_partition = 1;
  plVar45 = puVar46;
  goto LAB_001ed4a0;
LAB_001efaf9:
  puVar15 = *(undefined8 **)((long)puVar46 + 0x588);
  puVar15[4] = *(undefined8 *)((long)puVar46 + 0x5b0);
  uVar16 = *(undefined8 *)((long)puVar46 + 0x590);
  uVar17 = *(undefined8 *)((long)puVar46 + 0x598);
  uVar18 = *(undefined8 *)((long)puVar46 + 0x5a8);
  puVar15[2] = *(undefined8 *)((long)puVar46 + 0x5a0);
  puVar15[3] = uVar18;
  *puVar15 = uVar16;
  puVar15[1] = uVar17;
  if (*(long *)((long)puVar46 + 0x5c0) != 0) {
    *(undefined1 *)(*(long *)((long)puVar46 + 0x5c0) + 1) = **(undefined1 **)((long)puVar46 + 0x5b8)
    ;
  }
  if (*(char *)((long)puVar46 + 0x1fc) == '\x01') {
    BVar47 = ((pAVar50->common).seq_params)->sb_size;
    uVar40 = (ulong)BVar47;
    if (BVar47 == (BLOCK_SIZE)*(undefined8 *)((long)puVar46 + 0x18)) {
      puVar31 = (uint8_t *)(ulong)(*(char *)((long)puVar46 + 0x5d0) == '\x01');
      (((ThreadData_conflict *)td_00)->mb).cb_offset[0] = 0;
      (((ThreadData_conflict *)td_00)->mb).cb_offset[1] = 0;
      plVar45 = (long *)((long)puVar46 + -8);
      tile_data_01 = *(AV1_COMP **)((long)puVar46 + 0x50);
      tp_00 = *(uint **)((long)puVar46 + 0xa8);
      uVar52 = *(ulong *)((long)puVar46 + 0x98);
      rect_part_win_info_00 = *(RD_RECT_PART_WIN_INFO **)((long)puVar46 + 0xa0);
      pc_tree_00 = *(BLOCK_SIZE (**) [2] [2])((long)puVar46 + 0x5b8);
switchD_001ef166_caseD_25:
      plVar45[-1] = (long)pc_tree_00;
      plVar45[-2] = plVar45[0xf];
      plVar45[-3] = (long)puVar31;
      plVar45[-4] = 0x1efbb7;
      encode_sb(pAVar50,(ThreadData_conflict *)td_00,(TileDataEnc *)tile_data_01,
                (TokenExtra **)tp_00,(int)uVar52,(int)rect_part_win_info_00,
                *(RUN_TYPE *)(plVar45 + -3),*(BLOCK_SIZE *)(plVar45 + -2),(PC_TREE *)plVar45[-1],
                (int *)*plVar45);
      puVar46 = plVar45 + 1;
      PVar4 = (pAVar65->sf).part_sf.partition_search_type;
      *plVar45 = 0x1efbd4;
      av1_free_pc_tree_recursive((PC_TREE *)pc_tree_00,*(int *)((long)plVar45 + 0x74),0,0,PVar4);
      ((ThreadData_conflict *)puVar66)->pc_root = (PC_TREE *)0x0;
      td_00 = (uint8_t *)puVar66;
      goto LAB_001efdd5;
    }
    BVar24 = (((ThreadData_conflict *)td_00)->mb).sb_enc.max_partition_size;
    if (BVar24 < (BLOCK_SIZE)*(undefined8 *)((long)puVar46 + 0x18)) goto LAB_001efdb1;
    if (*(int *)(*(long *)((long)puVar46 + 0x5b8) + 0xf0) == 3) {
      BVar55 = BLOCK_INVALID;
      switch(BVar47) {
      case BLOCK_4X4:
        break;
      case BLOCK_4X8:
      case BLOCK_8X4:
      case BLOCK_8X16:
      case BLOCK_16X8:
      case BLOCK_16X32:
      case BLOCK_32X16:
        goto switchD_001efc2f_caseD_1;
      case BLOCK_8X8:
        uVar40 = 1;
        break;
      case BLOCK_16X16:
        uVar40 = 2;
        break;
      case BLOCK_32X32:
        uVar40 = 3;
        break;
      default:
        if (BVar47 == BLOCK_64X64) {
          uVar40 = 4;
        }
        else {
          if (BVar47 != BLOCK_128X128) goto switchD_001efc2f_caseD_1;
          uVar40 = 5;
        }
      }
      BVar55 = subsize_lookup[3][uVar40];
switchD_001efc2f_caseD_1:
      if ((BVar24 != *(BLOCK_SIZE *)((long)puVar46 + 0x18)) || (BVar55 == BVar24))
      goto LAB_001efdb1;
    }
    *(undefined8 *)((long)puVar46 + -0x10) = *(undefined8 *)((long)puVar46 + 0x5b8);
    *(undefined8 *)((long)puVar46 + -0x18) = *(undefined8 *)((long)puVar46 + 0x70);
    *(undefined8 *)((long)puVar46 + -0x20) = 1;
    *(undefined8 *)((long)puVar46 + -0x28) = 0x1efdad;
    encode_sb(pAVar50,(ThreadData_conflict *)td_00,*(TileDataEnc **)((long)puVar46 + 0x50),
              *(TokenExtra ***)((long)puVar46 + 0xa8),(int)*(undefined8 *)((long)puVar46 + 0x98),
              (int)*(undefined8 *)((long)puVar46 + 0xa0),*(RUN_TYPE *)((long)puVar46 + -0x20),
              *(BLOCK_SIZE *)((long)puVar46 + -0x18),*(PC_TREE **)((long)puVar46 + -0x10),
              *(int **)((long)puVar46 + -8));
  }
LAB_001efdb1:
  PVar4 = (pAVar50->sf).part_sf.partition_search_type;
  *(undefined8 *)((long)puVar46 + -8) = 0x1efdd5;
  av1_free_pc_tree_recursive
            (*(PC_TREE **)((long)puVar46 + 0x5b8),*(int *)((long)puVar46 + 0x6c),1,1,PVar4);
LAB_001efdd5:
  (((ThreadData_conflict *)td_00)->mb).rdmult = *(int *)((long)puVar46 + 0x25c);
  return (_Bool)*(undefined1 *)((long)puVar46 + 0x1fc);
}

Assistant:

bool av1_rd_pick_partition(AV1_COMP *const cpi, ThreadData *td,
                           TileDataEnc *tile_data, TokenExtra **tp, int mi_row,
                           int mi_col, BLOCK_SIZE bsize, RD_STATS *rd_cost,
                           RD_STATS best_rdc, PC_TREE *pc_tree,
                           SIMPLE_MOTION_DATA_TREE *sms_tree, int64_t *none_rd,
                           SB_MULTI_PASS_MODE multi_pass_mode,
                           RD_RECT_PART_WIN_INFO *rect_part_win_info) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  const TokenExtra *const tp_orig = *tp;
  PartitionSearchState part_search_state;

  // Initialization of state variables used in partition search.
  init_partition_search_state_params(x, cpi, &part_search_state, mi_row, mi_col,
                                     bsize);
  PartitionBlkParams blk_params = part_search_state.part_blk_params;

  set_sms_tree_partitioning(sms_tree, PARTITION_NONE);
  if (best_rdc.rdcost < 0) {
    av1_invalid_rd_stats(rd_cost);
    return part_search_state.found_best_partition;
  }
  if (bsize == cm->seq_params->sb_size) x->must_find_valid_partition = 0;

  // Override skipping rectangular partition operations for edge blocks.
  if (none_rd) *none_rd = 0;
  (void)*tp_orig;

#if CONFIG_COLLECT_PARTITION_STATS
  // Stats at the current quad tree
  PartitionTimingStats *part_timing_stats =
      &part_search_state.part_timing_stats;
  // Stats aggregated at frame level
  FramePartitionTimingStats *fr_part_timing_stats = &cpi->partition_stats;
#endif  // CONFIG_COLLECT_PARTITION_STATS

  // Override partition costs at the edges of the frame in the same
  // way as in read_partition (see decodeframe.c).
  if (!av1_blk_has_rows_and_cols(&blk_params))
    set_partition_cost_for_edge_blk(cm, &part_search_state);

  // Disable rectangular partitions for inner blocks when the current block is
  // forced to only use square partitions.
  if (bsize > cpi->sf.part_sf.use_square_partition_only_threshold) {
    part_search_state.partition_rect_allowed[HORZ] &= !blk_params.has_rows;
    part_search_state.partition_rect_allowed[VERT] &= !blk_params.has_cols;
  }

#ifndef NDEBUG
  // Nothing should rely on the default value of this array (which is just
  // leftover from encoding the previous block. Setting it to fixed pattern
  // when debugging.
  // bit 0, 1, 2 are blk_skip of each plane
  // bit 4, 5, 6 are initialization checking of each plane
  memset(x->txfm_search_info.blk_skip, 0x77,
         sizeof(x->txfm_search_info.blk_skip));
#endif  // NDEBUG

  assert(mi_size_wide[bsize] == mi_size_high[bsize]);

  // Set buffers and offsets.
  av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, bsize);

  if (cpi->oxcf.mode == ALLINTRA) {
    if (bsize == cm->seq_params->sb_size) {
      double var_min, var_max;
      log_sub_block_var(cpi, x, bsize, &var_min, &var_max);

      x->intra_sb_rdmult_modifier = 128;
      if ((var_min < 2.0) && (var_max > 4.0)) {
        if ((var_max - var_min) > 8.0) {
          x->intra_sb_rdmult_modifier -= 48;
        } else {
          x->intra_sb_rdmult_modifier -= (int)((var_max - var_min) * 6);
        }
      }
    }
  }

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);

  // Apply simple motion search for the entire super block with fixed block
  // size, e.g., 16x16, to collect features and write to files for the
  // external ML model.
  // TODO(chengchen): reduce motion search. This function is similar to
  // av1_get_max_min_partition_features().
  if (COLLECT_MOTION_SEARCH_FEATURE_SB && !frame_is_intra_only(cm) &&
      bsize == cm->seq_params->sb_size) {
    av1_collect_motion_search_features_sb(cpi, td, tile_data, mi_row, mi_col,
                                          bsize, /*features=*/NULL);
    collect_tpl_stats_sb(cpi, bsize, mi_row, mi_col, /*features=*/NULL);
  }

  // Update rd cost of the bound using the current multiplier.
  av1_rd_cost_update(x->rdmult, &best_rdc);

  if (bsize == BLOCK_16X16 && cpi->vaq_refresh)
    x->mb_energy = av1_log_block_var(cpi, x, bsize);

  // Set the context.
  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_prune_partitions_time);
#endif
  // Pruning: before searching any partition type, using source and simple
  // motion search results to prune out unlikely partitions.
  av1_prune_partitions_before_search(cpi, x, sms_tree, &part_search_state);

  // Pruning: eliminating partition types leading to coding block sizes outside
  // the min and max bsize limitations set from the encoder.
  av1_prune_partitions_by_max_min_bsize(&x->sb_enc, &part_search_state);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_prune_partitions_time);
#endif

  // Partition search
BEGIN_PARTITION_SEARCH:
  // If a valid partition is required, usually when the first round cannot find
  // a valid one under the cost limit after pruning, reset the limitations on
  // partition types and intra cnn output.
  if (x->must_find_valid_partition) {
    reset_part_limitations(cpi, &part_search_state);
    av1_prune_partitions_by_max_min_bsize(&x->sb_enc, &part_search_state);
    // Invalidate intra cnn output for key frames.
    if (frame_is_intra_only(cm) && bsize == BLOCK_64X64) {
      part_search_state.intra_part_info->quad_tree_idx = 0;
      part_search_state.intra_part_info->cnn_output_valid = 0;
    }
  }
  // Partition block source pixel variance.
  unsigned int pb_source_variance = UINT_MAX;

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, none_partition_search_time);
#endif

  if (cpi->oxcf.mode == ALLINTRA) {
    const bool bsize_at_least_16x16 = (bsize >= BLOCK_16X16);
    const bool prune_rect_part_using_4x4_var_deviation =
        (cpi->sf.part_sf.prune_rect_part_using_4x4_var_deviation &&
         !x->must_find_valid_partition);

    if (bsize_at_least_16x16 || prune_rect_part_using_4x4_var_deviation) {
      double var_min, var_max;
      log_sub_block_var(cpi, x, bsize, &var_min, &var_max);

      // Further pruning or in some cases reverse pruning when allintra is set.
      // This code helps visual and in some cases metrics quality where the
      // current block comprises at least one very low variance sub-block and at
      // least one where the variance is much higher.
      //
      // The idea is that in such cases there is danger of ringing and other
      // visual artifacts from a high variance feature such as an edge into a
      // very low variance region.
      //
      // The approach taken is to force break down / split to a smaller block
      // size to try and separate out the low variance and well predicted blocks
      // from the more complex ones and to prevent propagation of ringing over a
      // large region.
      if (bsize_at_least_16x16 && (var_min < 0.272) &&
          ((var_max - var_min) > 3.0)) {
        part_search_state.partition_none_allowed = 0;
        part_search_state.terminate_partition_search = 0;
        part_search_state.do_square_split = 1;
      } else if (prune_rect_part_using_4x4_var_deviation &&
                 (var_max - var_min < 3.0)) {
        // Prune rectangular partitions if the variance deviation of 4x4
        // sub-blocks within the block is less than a threshold (derived
        // empirically).
        part_search_state.do_rectangular_split = 0;
      }
    }
  }

  // PARTITION_NONE search stage.
  int64_t part_none_rd = INT64_MAX;
  none_partition_search(cpi, td, tile_data, x, pc_tree, sms_tree, &x_ctx,
                        &part_search_state, &best_rdc, &pb_source_variance,
                        none_rd, &part_none_rd);

#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, none_partition_search_time);
#endif
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, split_partition_search_time);
#endif
  // PARTITION_SPLIT search stage.
  int64_t part_split_rd = INT64_MAX;
  split_partition_search(cpi, td, tile_data, tp, x, pc_tree, sms_tree, &x_ctx,
                         &part_search_state, &best_rdc, multi_pass_mode,
                         &part_split_rd);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, split_partition_search_time);
#endif
  // Terminate partition search for child partition,
  // when NONE and SPLIT partition rd_costs are INT64_MAX.
  if (cpi->sf.part_sf.early_term_after_none_split &&
      part_none_rd == INT64_MAX && part_split_rd == INT64_MAX &&
      !x->must_find_valid_partition && (bsize != cm->seq_params->sb_size)) {
    part_search_state.terminate_partition_search = 1;
  }

  // Do not evaluate non-square partitions if NONE partition did not choose a
  // newmv mode and is skippable.
  if ((cpi->sf.part_sf.skip_non_sq_part_based_on_none >= 2) &&
      (pc_tree->none != NULL)) {
    if (x->qindex <= 200 && is_inter_mode(pc_tree->none->mic.mode) &&
        !have_newmv_in_inter_mode(pc_tree->none->mic.mode) &&
        pc_tree->none->skippable && !x->must_find_valid_partition &&
        bsize >= BLOCK_16X16)
      part_search_state.do_rectangular_split = 0;
  }

  // Prune partitions based on PARTITION_NONE and PARTITION_SPLIT.
  prune_partitions_after_split(cpi, x, sms_tree, &part_search_state, &best_rdc,
                               part_none_rd, part_split_rd);
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, rectangular_partition_search_time);
#endif
  // Rectangular partitions search stage.
  rectangular_partition_search(cpi, td, tile_data, tp, x, pc_tree, &x_ctx,
                               &part_search_state, &best_rdc,
                               rect_part_win_info, HORZ, VERT);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, rectangular_partition_search_time);
#endif

  if (pb_source_variance == UINT_MAX) {
    av1_setup_src_planes(x, cpi->source, mi_row, mi_col, num_planes, bsize);
    pb_source_variance = av1_get_perpixel_variance_facade(
        cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);
  }

  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part_search_state.do_rectangular_split));

  const int prune_ext_part_state = prune_ext_part_none_skippable(
      pc_tree->none, x->must_find_valid_partition,
      cpi->sf.part_sf.skip_non_sq_part_based_on_none, bsize);

  const int ab_partition_allowed = allow_ab_partition_search(
      &part_search_state, &cpi->sf.part_sf, pc_tree->partitioning,
      x->must_find_valid_partition, prune_ext_part_state, best_rdc.rdcost);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, ab_partitions_search_time);
#endif
  // AB partitions search stage.
  ab_partitions_search(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       &part_search_state, &best_rdc, rect_part_win_info,
                       pb_source_variance, ab_partition_allowed, HORZ_A,
                       VERT_B);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, ab_partitions_search_time);
#endif

  // 4-way partitions search stage.
  int part4_search_allowed[NUM_PART4_TYPES] = { 1, 1 };
  // Prune 4-way partition search.
  prune_4_way_partition_search(cpi, x, pc_tree, &part_search_state, &best_rdc,
                               pb_source_variance, prune_ext_part_state,
                               part4_search_allowed);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, rd_pick_4partition_time);
#endif
  // PARTITION_HORZ_4
  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part4_search_allowed[HORZ4]));
  if (!part_search_state.terminate_partition_search &&
      part4_search_allowed[HORZ4]) {
    const int inc_step[NUM_PART4_TYPES] = { mi_size_high[blk_params.bsize] / 4,
                                            0 };
    // Evaluation of Horz4 partition type.
    rd_pick_4partition(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       pc_tree->horizontal4, &part_search_state, &best_rdc,
                       inc_step, PARTITION_HORZ_4);
  }

  // PARTITION_VERT_4
  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part4_search_allowed[VERT4]));
  if (!part_search_state.terminate_partition_search &&
      part4_search_allowed[VERT4] && blk_params.has_cols) {
    const int inc_step[NUM_PART4_TYPES] = { 0, mi_size_wide[blk_params.bsize] /
                                                   4 };
    // Evaluation of Vert4 partition type.
    rd_pick_4partition(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       pc_tree->vertical4, &part_search_state, &best_rdc,
                       inc_step, PARTITION_VERT_4);
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, rd_pick_4partition_time);
#endif

  if (bsize == cm->seq_params->sb_size &&
      !part_search_state.found_best_partition) {
    // Did not find a valid partition, go back and search again, with less
    // constraint on which partition types to search.
    x->must_find_valid_partition = 1;
#if CONFIG_COLLECT_PARTITION_STATS
    fr_part_timing_stats->partition_redo += 1;
#endif  // CONFIG_COLLECT_PARTITION_STATS
    goto BEGIN_PARTITION_SEARCH;
  }

  // Store the final rd cost
  *rd_cost = best_rdc;

  // Also record the best partition in simple motion data tree because it is
  // necessary for the related speed features.
  set_sms_tree_partitioning(sms_tree, pc_tree->partitioning);

#if CONFIG_COLLECT_PARTITION_STATS
  if (best_rdc.rate < INT_MAX && best_rdc.dist < INT64_MAX) {
    part_timing_stats->partition_decisions[pc_tree->partitioning] += 1;
  }

  // If CONFIG_COLLECT_PARTITION_STATS is 1, then print out the stats for each
  // prediction block.
  print_partition_timing_stats_with_rdcost(
      part_timing_stats, mi_row, mi_col, bsize,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index],
      cm->current_frame.frame_number, &best_rdc, "part_timing.csv");
  const bool print_timing_stats = false;
  if (print_timing_stats) {
    print_partition_timing_stats(part_timing_stats, cm->show_frame,
                                 frame_is_intra_only(cm), bsize,
                                 "part_timing_data.csv");
  }
  // If CONFIG_COLLECTION_PARTITION_STATS is 2, then we print out the stats for
  // the whole clip. So we need to pass the information upstream to the encoder.
  accumulate_partition_timing_stats(fr_part_timing_stats, part_timing_stats,
                                    bsize);
#endif  // CONFIG_COLLECT_PARTITION_STATS

  // Reset the PC_TREE deallocation flag.
  int pc_tree_dealloc = 0;

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_sb_time);
#endif
  if (part_search_state.found_best_partition) {
    if (bsize == cm->seq_params->sb_size) {
      // Encode the superblock.
      const int emit_output = multi_pass_mode != SB_DRY_PASS;
      const RUN_TYPE run_type = emit_output ? OUTPUT_ENABLED : DRY_RUN_NORMAL;

      // Write partition tree to file. Not used by default.
      if (COLLECT_MOTION_SEARCH_FEATURE_SB) {
        write_partition_tree(cpi, pc_tree, bsize, mi_row, mi_col);
        ++cpi->sb_counter;
      }

      set_cb_offsets(x->cb_offset, 0, 0);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, run_type, bsize,
                pc_tree, NULL);
      assert(pc_tree == td->pc_root);
      // Dealloc the whole PC_TREE after a superblock is done.
      av1_free_pc_tree_recursive(pc_tree, num_planes, 0, 0,
                                 cpi->sf.part_sf.partition_search_type);
      pc_tree = NULL;
      td->pc_root = NULL;
      pc_tree_dealloc = 1;
    } else if (should_do_dry_run_encode_for_current_block(
                   cm->seq_params->sb_size, x->sb_enc.max_partition_size,
                   pc_tree->index, bsize)) {
      // Encode the smaller blocks in DRY_RUN mode.
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_NORMAL, bsize,
                pc_tree, NULL);
    }
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_sb_time);
#endif

  // If the tree still exists (non-superblock), dealloc most nodes, only keep
  // nodes for the best partition and PARTITION_NONE.
  if (pc_tree_dealloc == 0)
    av1_free_pc_tree_recursive(pc_tree, num_planes, 1, 1,
                               cpi->sf.part_sf.partition_search_type);

  if (bsize == cm->seq_params->sb_size) {
    assert(best_rdc.rate < INT_MAX);
    assert(best_rdc.dist < INT64_MAX);
  } else {
    assert(tp_orig == *tp);
  }

  // Restore the rd multiplier.
  x->rdmult = orig_rdmult;
  return part_search_state.found_best_partition;
}